

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx2::CurveNiMBIntersector1<8>::
     occluded_t<embree::avx2::SweepCurve1Intersector1<embree::BezierCurveT>,embree::avx2::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Primitive PVar8;
  Geometry *pGVar9;
  __int_type_conflict _Var10;
  long lVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  int iVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  bool bVar57;
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  bool bVar72;
  undefined1 auVar73 [12];
  undefined1 auVar74 [32];
  bool bVar75;
  bool bVar76;
  bool bVar77;
  bool bVar78;
  bool bVar79;
  bool bVar80;
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  uint uVar84;
  ulong uVar85;
  byte bVar86;
  long lVar87;
  uint uVar88;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  long lVar89;
  undefined4 uVar90;
  ulong uVar91;
  byte unaff_R14B;
  float fVar92;
  undefined8 uVar93;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar113 [32];
  undefined1 auVar118 [64];
  undefined1 auVar119 [64];
  undefined1 auVar120 [64];
  float fVar121;
  float fVar150;
  float fVar151;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar156 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  float fVar172;
  float fVar173;
  float fVar174;
  undefined1 auVar163 [32];
  undefined1 auVar157 [16];
  float fVar171;
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  float fVar196;
  float fVar207;
  float fVar208;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar202 [16];
  undefined1 auVar206 [32];
  undefined4 uVar224;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined4 uVar225;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [64];
  float fVar244;
  float fVar246;
  float fVar247;
  float fVar248;
  undefined1 in_ZMM10 [64];
  undefined1 auVar245 [64];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar249 [32];
  float fVar255;
  float fVar256;
  undefined1 in_ZMM11 [64];
  undefined1 auVar253 [64];
  undefined1 auVar254 [64];
  float fVar257;
  float fVar262;
  float fVar263;
  float fVar264;
  undefined1 auVar258 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [64];
  undefined1 auVar269 [64];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  float fVar281;
  float fVar282;
  float fVar283;
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  RTCFilterFunctionNArguments args;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  bool local_b11;
  int local_b04;
  undefined1 local_b00 [8];
  float fStack_af8;
  float fStack_af4;
  float fStack_af0;
  float fStack_aec;
  float fStack_ae8;
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  ulong local_a88;
  undefined1 local_a80 [32];
  undefined1 local_a50 [8];
  float fStack_a48;
  float fStack_a44;
  undefined1 local_a40 [16];
  undefined1 local_a30 [16];
  undefined1 local_a20 [16];
  RTCFilterFunctionNArguments local_a10;
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined8 local_960;
  undefined4 local_958;
  float local_954;
  undefined4 local_950;
  undefined4 local_94c;
  undefined4 local_948;
  uint local_944;
  uint local_940;
  ulong local_928;
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  undefined1 auStack_7b0 [16];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_750 [16];
  undefined1 local_740 [16];
  Primitive *local_730;
  ulong local_728;
  undefined1 local_720 [32];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  undefined4 uStack_664;
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  float local_480;
  float fStack_47c;
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined1 local_1a0 [32];
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar259 [32];
  
  PVar8 = prim[1];
  uVar91 = (ulong)(byte)PVar8;
  lVar87 = uVar91 * 0x25;
  auVar101 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                        *(undefined1 (*) [16])(prim + lVar87 + 6));
  fVar92 = *(float *)(prim + lVar87 + 0x12);
  auVar94._0_4_ = fVar92 * auVar101._0_4_;
  auVar94._4_4_ = fVar92 * auVar101._4_4_;
  auVar94._8_4_ = fVar92 * auVar101._8_4_;
  auVar94._12_4_ = fVar92 * auVar101._12_4_;
  auVar156._0_4_ = fVar92 * (ray->dir).field_0.m128[0];
  auVar156._4_4_ = fVar92 * (ray->dir).field_0.m128[1];
  auVar156._8_4_ = fVar92 * (ray->dir).field_0.m128[2];
  auVar156._12_4_ = fVar92 * (ray->dir).field_0.m128[3];
  auVar101._8_8_ = 0;
  auVar101._0_8_ = *(ulong *)(prim + uVar91 * 4 + 6);
  auVar113 = vpmovsxbd_avx2(auVar101);
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar201._8_8_ = 0;
  auVar201._0_8_ = *(ulong *)(prim + uVar91 * 5 + 6);
  auVar17 = vpmovsxbd_avx2(auVar201);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar238._8_8_ = 0;
  auVar238._0_8_ = *(ulong *)(prim + uVar91 * 6 + 6);
  auVar18 = vpmovsxbd_avx2(auVar238);
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar137._8_8_ = 0;
  auVar137._0_8_ = *(ulong *)(prim + uVar91 * 0xf + 6);
  auVar19 = vpmovsxbd_avx2(auVar137);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + 6);
  auVar20 = vpmovsxbd_avx2(auVar4);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar159._8_8_ = 0;
  auVar159._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + uVar91 + 6);
  auVar167 = vpmovsxbd_avx2(auVar159);
  auVar167 = vcvtdq2ps_avx(auVar167);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar91 * 0x1a + 6);
  auVar194 = vpmovsxbd_avx2(auVar5);
  auVar194 = vcvtdq2ps_avx(auVar194);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar91 * 0x1b + 6);
  auVar106 = vpmovsxbd_avx2(auVar6);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar91 * 0x1c + 6);
  auVar227 = vpmovsxbd_avx2(auVar7);
  auVar227 = vcvtdq2ps_avx(auVar227);
  auVar233._4_4_ = auVar156._0_4_;
  auVar233._0_4_ = auVar156._0_4_;
  auVar233._8_4_ = auVar156._0_4_;
  auVar233._12_4_ = auVar156._0_4_;
  auVar233._16_4_ = auVar156._0_4_;
  auVar233._20_4_ = auVar156._0_4_;
  auVar233._24_4_ = auVar156._0_4_;
  auVar233._28_4_ = auVar156._0_4_;
  auVar101 = vmovshdup_avx(auVar156);
  uVar93 = auVar101._0_8_;
  auVar274._8_8_ = uVar93;
  auVar274._0_8_ = uVar93;
  auVar274._16_8_ = uVar93;
  auVar274._24_8_ = uVar93;
  auVar101 = vshufps_avx(auVar156,auVar156,0xaa);
  fVar92 = auVar101._0_4_;
  auVar243._0_4_ = fVar92 * auVar18._0_4_;
  fVar121 = auVar101._4_4_;
  auVar243._4_4_ = fVar121 * auVar18._4_4_;
  auVar243._8_4_ = fVar92 * auVar18._8_4_;
  auVar243._12_4_ = fVar121 * auVar18._12_4_;
  auVar243._16_4_ = fVar92 * auVar18._16_4_;
  auVar243._20_4_ = fVar121 * auVar18._20_4_;
  auVar243._28_36_ = in_ZMM11._28_36_;
  auVar243._24_4_ = fVar92 * auVar18._24_4_;
  auVar268._0_4_ = auVar167._0_4_ * fVar92;
  auVar268._4_4_ = auVar167._4_4_ * fVar121;
  auVar268._8_4_ = auVar167._8_4_ * fVar92;
  auVar268._12_4_ = auVar167._12_4_ * fVar121;
  auVar268._16_4_ = auVar167._16_4_ * fVar92;
  auVar268._20_4_ = auVar167._20_4_ * fVar121;
  auVar268._28_36_ = in_ZMM10._28_36_;
  auVar268._24_4_ = auVar167._24_4_ * fVar92;
  auVar241._0_4_ = auVar227._0_4_ * fVar92;
  auVar241._4_4_ = auVar227._4_4_ * fVar121;
  auVar241._8_4_ = auVar227._8_4_ * fVar92;
  auVar241._12_4_ = auVar227._12_4_ * fVar121;
  auVar241._16_4_ = auVar227._16_4_ * fVar92;
  auVar241._20_4_ = auVar227._20_4_ * fVar121;
  auVar241._24_4_ = auVar227._24_4_ * fVar92;
  auVar241._28_4_ = 0;
  auVar101 = vfmadd231ps_fma(auVar243._0_32_,auVar274,auVar17);
  auVar201 = vfmadd231ps_fma(auVar268._0_32_,auVar274,auVar20);
  auVar238 = vfmadd231ps_fma(auVar241,auVar106,auVar274);
  auVar137 = vfmadd231ps_fma(ZEXT1632(auVar101),auVar233,auVar113);
  auVar201 = vfmadd231ps_fma(ZEXT1632(auVar201),auVar233,auVar19);
  auVar238 = vfmadd231ps_fma(ZEXT1632(auVar238),auVar194,auVar233);
  auVar234._4_4_ = auVar94._0_4_;
  auVar234._0_4_ = auVar94._0_4_;
  auVar234._8_4_ = auVar94._0_4_;
  auVar234._12_4_ = auVar94._0_4_;
  auVar234._16_4_ = auVar94._0_4_;
  auVar234._20_4_ = auVar94._0_4_;
  auVar234._24_4_ = auVar94._0_4_;
  auVar234._28_4_ = auVar94._0_4_;
  auVar101 = vmovshdup_avx(auVar94);
  uVar93 = auVar101._0_8_;
  auVar275._8_8_ = uVar93;
  auVar275._0_8_ = uVar93;
  auVar275._16_8_ = uVar93;
  auVar275._24_8_ = uVar93;
  auVar101 = vshufps_avx(auVar94,auVar94,0xaa);
  fVar92 = auVar101._0_4_;
  auVar107._0_4_ = fVar92 * auVar18._0_4_;
  fVar121 = auVar101._4_4_;
  auVar107._4_4_ = fVar121 * auVar18._4_4_;
  auVar107._8_4_ = fVar92 * auVar18._8_4_;
  auVar107._12_4_ = fVar121 * auVar18._12_4_;
  auVar107._16_4_ = fVar92 * auVar18._16_4_;
  auVar107._20_4_ = fVar121 * auVar18._20_4_;
  auVar107._24_4_ = fVar92 * auVar18._24_4_;
  auVar107._28_4_ = 0;
  auVar21._4_4_ = auVar167._4_4_ * fVar121;
  auVar21._0_4_ = auVar167._0_4_ * fVar92;
  auVar21._8_4_ = auVar167._8_4_ * fVar92;
  auVar21._12_4_ = auVar167._12_4_ * fVar121;
  auVar21._16_4_ = auVar167._16_4_ * fVar92;
  auVar21._20_4_ = auVar167._20_4_ * fVar121;
  auVar21._24_4_ = auVar167._24_4_ * fVar92;
  auVar21._28_4_ = auVar18._28_4_;
  auVar18._4_4_ = auVar227._4_4_ * fVar121;
  auVar18._0_4_ = auVar227._0_4_ * fVar92;
  auVar18._8_4_ = auVar227._8_4_ * fVar92;
  auVar18._12_4_ = auVar227._12_4_ * fVar121;
  auVar18._16_4_ = auVar227._16_4_ * fVar92;
  auVar18._20_4_ = auVar227._20_4_ * fVar121;
  auVar18._24_4_ = auVar227._24_4_ * fVar92;
  auVar18._28_4_ = fVar121;
  auVar101 = vfmadd231ps_fma(auVar107,auVar275,auVar17);
  auVar4 = vfmadd231ps_fma(auVar21,auVar275,auVar20);
  auVar159 = vfmadd231ps_fma(auVar18,auVar275,auVar106);
  auVar94 = vfmadd231ps_fma(ZEXT1632(auVar101),auVar234,auVar113);
  auVar156 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar234,auVar19);
  local_720._8_4_ = 0x7fffffff;
  local_720._0_8_ = 0x7fffffff7fffffff;
  local_720._12_4_ = 0x7fffffff;
  local_720._16_4_ = 0x7fffffff;
  local_720._20_4_ = 0x7fffffff;
  local_720._24_4_ = 0x7fffffff;
  local_720._28_4_ = 0x7fffffff;
  auVar258._8_4_ = 0x219392ef;
  auVar258._0_8_ = 0x219392ef219392ef;
  auVar258._12_4_ = 0x219392ef;
  auVar258._16_4_ = 0x219392ef;
  auVar258._20_4_ = 0x219392ef;
  auVar258._24_4_ = 0x219392ef;
  auVar258._28_4_ = 0x219392ef;
  auVar113 = vandps_avx(ZEXT1632(auVar137),local_720);
  auVar113 = vcmpps_avx(auVar113,auVar258,1);
  auVar17 = vblendvps_avx(ZEXT1632(auVar137),auVar258,auVar113);
  auVar113 = vandps_avx(ZEXT1632(auVar201),local_720);
  auVar113 = vcmpps_avx(auVar113,auVar258,1);
  auVar18 = vblendvps_avx(ZEXT1632(auVar201),auVar258,auVar113);
  auVar113 = vandps_avx(ZEXT1632(auVar238),local_720);
  auVar113 = vcmpps_avx(auVar113,auVar258,1);
  auVar113 = vblendvps_avx(ZEXT1632(auVar238),auVar258,auVar113);
  auVar167 = vrcpps_avx(auVar17);
  fVar92 = ((ray->dir).field_0.m128[3] - *(float *)(prim + lVar87 + 0x16)) *
           *(float *)(prim + lVar87 + 0x1a);
  auVar95 = vfmadd231ps_fma(ZEXT1632(auVar159),auVar234,auVar194);
  auVar230._4_4_ = fVar92;
  auVar230._0_4_ = fVar92;
  auVar230._8_4_ = fVar92;
  auVar230._12_4_ = fVar92;
  auVar230._16_4_ = fVar92;
  auVar230._20_4_ = fVar92;
  auVar230._24_4_ = fVar92;
  auVar230._28_4_ = fVar92;
  auVar19 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar91 * 7 + 6));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar20 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar91 * 0xb + 6));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar20 = vsubps_avx(auVar20,auVar19);
  auVar137 = vfmadd213ps_fma(auVar20,auVar230,auVar19);
  auVar19 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar91 * 9 + 6));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar20 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar91 * 0xd + 6));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar20 = vsubps_avx(auVar20,auVar19);
  auVar4 = vfmadd213ps_fma(auVar20,auVar230,auVar19);
  auVar19 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar91 * 0x12 + 6));
  auVar19 = vcvtdq2ps_avx(auVar19);
  uVar85 = (ulong)(uint)((int)(uVar91 * 5) << 2);
  auVar20 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar91 * 2 + uVar85 + 6));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar20 = vsubps_avx(auVar20,auVar19);
  auVar159 = vfmadd213ps_fma(auVar20,auVar230,auVar19);
  auVar19 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar85 + 6));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar20 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar91 * 0x18 + 6));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar20 = vsubps_avx(auVar20,auVar19);
  auVar5 = vfmadd213ps_fma(auVar20,auVar230,auVar19);
  auVar19 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar91 * 0x1d + 6));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar20 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar91 + (ulong)(byte)PVar8 * 0x20 + 6));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar20 = vsubps_avx(auVar20,auVar19);
  auVar6 = vfmadd213ps_fma(auVar20,auVar230,auVar19);
  auVar268 = ZEXT1664(auVar6);
  auVar19 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + ((ulong)(byte)PVar8 * 0x20 - uVar91) + 6));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar20 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar91 * 0x23 + 6));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar20 = vsubps_avx(auVar20,auVar19);
  auVar276._8_4_ = 0x3f800000;
  auVar276._0_8_ = &DAT_3f8000003f800000;
  auVar276._12_4_ = 0x3f800000;
  auVar276._16_4_ = 0x3f800000;
  auVar276._20_4_ = 0x3f800000;
  auVar276._24_4_ = 0x3f800000;
  auVar276._28_4_ = 0x3f800000;
  auVar7 = vfmadd213ps_fma(auVar20,auVar230,auVar19);
  auVar19 = vrcpps_avx(auVar18);
  auVar101 = vfnmadd213ps_fma(auVar17,auVar167,auVar276);
  auVar101 = vfmadd132ps_fma(ZEXT1632(auVar101),auVar167,auVar167);
  auVar201 = vfnmadd213ps_fma(auVar18,auVar19,auVar276);
  auVar201 = vfmadd132ps_fma(ZEXT1632(auVar201),auVar19,auVar19);
  auVar17 = vrcpps_avx(auVar113);
  auVar238 = vfnmadd213ps_fma(auVar113,auVar17,auVar276);
  auVar238 = vfmadd132ps_fma(ZEXT1632(auVar238),auVar17,auVar17);
  auVar113 = vsubps_avx(ZEXT1632(auVar137),ZEXT1632(auVar94));
  auVar17 = vsubps_avx(ZEXT1632(auVar4),ZEXT1632(auVar94));
  auVar19._4_4_ = auVar101._4_4_ * auVar113._4_4_;
  auVar19._0_4_ = auVar101._0_4_ * auVar113._0_4_;
  auVar19._8_4_ = auVar101._8_4_ * auVar113._8_4_;
  auVar19._12_4_ = auVar101._12_4_ * auVar113._12_4_;
  auVar19._16_4_ = auVar113._16_4_ * 0.0;
  auVar19._20_4_ = auVar113._20_4_ * 0.0;
  auVar19._24_4_ = auVar113._24_4_ * 0.0;
  auVar19._28_4_ = auVar113._28_4_;
  auVar20._4_4_ = auVar101._4_4_ * auVar17._4_4_;
  auVar20._0_4_ = auVar101._0_4_ * auVar17._0_4_;
  auVar20._8_4_ = auVar101._8_4_ * auVar17._8_4_;
  auVar20._12_4_ = auVar101._12_4_ * auVar17._12_4_;
  auVar20._16_4_ = auVar17._16_4_ * 0.0;
  auVar20._20_4_ = auVar17._20_4_ * 0.0;
  auVar20._24_4_ = auVar17._24_4_ * 0.0;
  auVar20._28_4_ = auVar17._28_4_;
  auVar113 = vsubps_avx(ZEXT1632(auVar159),ZEXT1632(auVar156));
  auVar17 = vsubps_avx(ZEXT1632(auVar5),ZEXT1632(auVar156));
  auVar167._4_4_ = auVar201._4_4_ * auVar113._4_4_;
  auVar167._0_4_ = auVar201._0_4_ * auVar113._0_4_;
  auVar167._8_4_ = auVar201._8_4_ * auVar113._8_4_;
  auVar167._12_4_ = auVar201._12_4_ * auVar113._12_4_;
  auVar167._16_4_ = auVar113._16_4_ * 0.0;
  auVar167._20_4_ = auVar113._20_4_ * 0.0;
  auVar167._24_4_ = auVar113._24_4_ * 0.0;
  auVar167._28_4_ = auVar113._28_4_;
  auVar194._4_4_ = auVar201._4_4_ * auVar17._4_4_;
  auVar194._0_4_ = auVar201._0_4_ * auVar17._0_4_;
  auVar194._8_4_ = auVar201._8_4_ * auVar17._8_4_;
  auVar194._12_4_ = auVar201._12_4_ * auVar17._12_4_;
  auVar194._16_4_ = auVar17._16_4_ * 0.0;
  auVar194._20_4_ = auVar17._20_4_ * 0.0;
  auVar194._24_4_ = auVar17._24_4_ * 0.0;
  auVar194._28_4_ = auVar17._28_4_;
  auVar113 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar95));
  auVar106._4_4_ = auVar238._4_4_ * auVar113._4_4_;
  auVar106._0_4_ = auVar238._0_4_ * auVar113._0_4_;
  auVar106._8_4_ = auVar238._8_4_ * auVar113._8_4_;
  auVar106._12_4_ = auVar238._12_4_ * auVar113._12_4_;
  auVar106._16_4_ = auVar113._16_4_ * 0.0;
  auVar106._20_4_ = auVar113._20_4_ * 0.0;
  auVar106._24_4_ = auVar113._24_4_ * 0.0;
  auVar106._28_4_ = auVar113._28_4_;
  auVar113 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar95));
  auVar227._4_4_ = auVar238._4_4_ * auVar113._4_4_;
  auVar227._0_4_ = auVar238._0_4_ * auVar113._0_4_;
  auVar227._8_4_ = auVar238._8_4_ * auVar113._8_4_;
  auVar227._12_4_ = auVar238._12_4_ * auVar113._12_4_;
  auVar227._16_4_ = auVar113._16_4_ * 0.0;
  auVar227._20_4_ = auVar113._20_4_ * 0.0;
  auVar227._24_4_ = auVar113._24_4_ * 0.0;
  auVar227._28_4_ = auVar113._28_4_;
  auVar113 = vpminsd_avx2(auVar19,auVar20);
  auVar17 = vpminsd_avx2(auVar167,auVar194);
  auVar113 = vmaxps_avx(auVar113,auVar17);
  auVar17 = vpminsd_avx2(auVar106,auVar227);
  uVar90 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar235._4_4_ = uVar90;
  auVar235._0_4_ = uVar90;
  auVar235._8_4_ = uVar90;
  auVar235._12_4_ = uVar90;
  auVar235._16_4_ = uVar90;
  auVar235._20_4_ = uVar90;
  auVar235._24_4_ = uVar90;
  auVar235._28_4_ = uVar90;
  auVar17 = vmaxps_avx(auVar17,auVar235);
  auVar113 = vmaxps_avx(auVar113,auVar17);
  local_2e0._4_4_ = auVar113._4_4_ * 0.99999964;
  local_2e0._0_4_ = auVar113._0_4_ * 0.99999964;
  local_2e0._8_4_ = auVar113._8_4_ * 0.99999964;
  local_2e0._12_4_ = auVar113._12_4_ * 0.99999964;
  local_2e0._16_4_ = auVar113._16_4_ * 0.99999964;
  local_2e0._20_4_ = auVar113._20_4_ * 0.99999964;
  local_2e0._24_4_ = auVar113._24_4_ * 0.99999964;
  local_2e0._28_4_ = auVar113._28_4_;
  auVar113 = vpmaxsd_avx2(auVar19,auVar20);
  auVar17 = vpmaxsd_avx2(auVar167,auVar194);
  auVar113 = vminps_avx(auVar113,auVar17);
  auVar17 = vpmaxsd_avx2(auVar106,auVar227);
  fVar92 = ray->tfar;
  auVar163._4_4_ = fVar92;
  auVar163._0_4_ = fVar92;
  auVar163._8_4_ = fVar92;
  auVar163._12_4_ = fVar92;
  auVar163._16_4_ = fVar92;
  auVar163._20_4_ = fVar92;
  auVar163._24_4_ = fVar92;
  auVar163._28_4_ = fVar92;
  auVar17 = vminps_avx(auVar17,auVar163);
  auVar113 = vminps_avx(auVar113,auVar17);
  auVar17._4_4_ = auVar113._4_4_ * 1.0000004;
  auVar17._0_4_ = auVar113._0_4_ * 1.0000004;
  auVar17._8_4_ = auVar113._8_4_ * 1.0000004;
  auVar17._12_4_ = auVar113._12_4_ * 1.0000004;
  auVar17._16_4_ = auVar113._16_4_ * 1.0000004;
  auVar17._20_4_ = auVar113._20_4_ * 1.0000004;
  auVar17._24_4_ = auVar113._24_4_ * 1.0000004;
  auVar17._28_4_ = auVar113._28_4_;
  auVar104._1_3_ = 0;
  auVar104[0] = PVar8;
  auVar104[4] = PVar8;
  auVar104._5_3_ = 0;
  auVar104[8] = PVar8;
  auVar104._9_3_ = 0;
  auVar104[0xc] = PVar8;
  auVar104._13_3_ = 0;
  auVar104[0x10] = PVar8;
  auVar104._17_3_ = 0;
  auVar104[0x14] = PVar8;
  auVar104._21_3_ = 0;
  auVar104[0x18] = PVar8;
  auVar104._25_3_ = 0;
  auVar104[0x1c] = PVar8;
  auVar104._29_3_ = 0;
  auVar113 = vcmpps_avx(local_2e0,auVar17,2);
  auVar17 = vpcmpgtd_avx2(auVar104,_DAT_0205a920);
  auVar113 = vandps_avx(auVar113,auVar17);
  uVar84 = vmovmskps_avx(auVar113);
  local_b11 = uVar84 != 0;
  if (uVar84 == 0) {
    return local_b11;
  }
  uVar84 = uVar84 & 0xff;
  auVar113._16_16_ = mm_lookupmask_ps._240_16_;
  auVar113._0_16_ = mm_lookupmask_ps._240_16_;
  local_280 = vblendps_avx(auVar113,ZEXT832(0) << 0x20,0x80);
  local_730 = prim;
LAB_01923697:
  lVar87 = 0;
  local_728 = (ulong)uVar84;
  for (uVar91 = local_728; (uVar91 & 1) == 0; uVar91 = uVar91 >> 1 | 0x8000000000000000) {
    lVar87 = lVar87 + 1;
  }
  local_a88 = (ulong)*(uint *)(local_730 + 2);
  local_928 = (ulong)*(uint *)(local_730 + lVar87 * 4 + 6);
  pGVar9 = (context->scene->geometries).items[local_a88].ptr;
  uVar91 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                           local_928 *
                           pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar92 = (pGVar9->time_range).lower;
  fVar92 = pGVar9->fnumTimeSegments *
           (((ray->dir).field_0.m128[3] - fVar92) / ((pGVar9->time_range).upper - fVar92));
  auVar101 = vroundss_avx(ZEXT416((uint)fVar92),ZEXT416((uint)fVar92),9);
  auVar101 = vminss_avx(auVar101,ZEXT416((uint)(pGVar9->fnumTimeSegments + -1.0)));
  auVar101 = vmaxss_avx(ZEXT816(0) << 0x20,auVar101);
  fVar92 = fVar92 - auVar101._0_4_;
  _Var10 = pGVar9[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar89 = (long)(int)auVar101._0_4_ * 0x38;
  lVar87 = *(long *)(_Var10 + 0x10 + lVar89);
  lVar11 = *(long *)(_Var10 + 0x38 + lVar89);
  lVar12 = *(long *)(_Var10 + 0x48 + lVar89);
  pfVar1 = (float *)(lVar11 + uVar91 * lVar12);
  auVar122._0_4_ = fVar92 * *pfVar1;
  auVar122._4_4_ = fVar92 * pfVar1[1];
  auVar122._8_4_ = fVar92 * pfVar1[2];
  auVar122._12_4_ = fVar92 * pfVar1[3];
  pfVar1 = (float *)(lVar11 + (uVar91 + 1) * lVar12);
  auVar157._0_4_ = fVar92 * *pfVar1;
  auVar157._4_4_ = fVar92 * pfVar1[1];
  auVar157._8_4_ = fVar92 * pfVar1[2];
  auVar157._12_4_ = fVar92 * pfVar1[3];
  pfVar1 = (float *)(lVar11 + (uVar91 + 2) * lVar12);
  auVar197._0_4_ = fVar92 * *pfVar1;
  auVar197._4_4_ = fVar92 * pfVar1[1];
  auVar197._8_4_ = fVar92 * pfVar1[2];
  auVar197._12_4_ = fVar92 * pfVar1[3];
  pfVar1 = (float *)(lVar11 + lVar12 * (uVar91 + 3));
  auVar175._0_4_ = fVar92 * *pfVar1;
  auVar175._4_4_ = fVar92 * pfVar1[1];
  auVar175._8_4_ = fVar92 * pfVar1[2];
  auVar175._12_4_ = fVar92 * pfVar1[3];
  lVar11 = *(long *)(_Var10 + lVar89);
  fVar92 = 1.0 - fVar92;
  auVar95._4_4_ = fVar92;
  auVar95._0_4_ = fVar92;
  auVar95._8_4_ = fVar92;
  auVar95._12_4_ = fVar92;
  auVar137 = vfmadd231ps_fma(auVar122,auVar95,*(undefined1 (*) [16])(lVar11 + lVar87 * uVar91));
  auVar4 = vfmadd231ps_fma(auVar157,auVar95,*(undefined1 (*) [16])(lVar11 + lVar87 * (uVar91 + 1)));
  auVar159 = vfmadd231ps_fma(auVar197,auVar95,*(undefined1 (*) [16])(lVar11 + lVar87 * (uVar91 + 2))
                            );
  auVar5 = vfmadd231ps_fma(auVar175,auVar95,*(undefined1 (*) [16])(lVar11 + lVar87 * (uVar91 + 3)));
  auVar213._0_4_ = (auVar137._0_4_ + auVar4._0_4_ + auVar159._0_4_ + auVar5._0_4_) * 0.25;
  auVar213._4_4_ = (auVar137._4_4_ + auVar4._4_4_ + auVar159._4_4_ + auVar5._4_4_) * 0.25;
  auVar213._8_4_ = (auVar137._8_4_ + auVar4._8_4_ + auVar159._8_4_ + auVar5._8_4_) * 0.25;
  auVar213._12_4_ = (auVar137._12_4_ + auVar4._12_4_ + auVar159._12_4_ + auVar5._12_4_) * 0.25;
  aVar2 = (ray->org).field_0;
  aVar3 = (ray->dir).field_0.field_1;
  auVar101 = vsubps_avx(auVar213,(undefined1  [16])aVar2);
  auVar101 = vdpps_avx(auVar101,(undefined1  [16])aVar3,0x7f);
  auVar201 = vdpps_avx((undefined1  [16])aVar3,(undefined1  [16])aVar3,0x7f);
  auVar238 = vrcpss_avx(auVar201,auVar201);
  auVar201 = vfnmadd213ss_fma(auVar238,auVar201,ZEXT416(0x40000000));
  fVar92 = auVar101._0_4_ * auVar238._0_4_ * auVar201._0_4_;
  local_750 = ZEXT416((uint)fVar92);
  auVar214._4_4_ = fVar92;
  auVar214._0_4_ = fVar92;
  auVar214._8_4_ = fVar92;
  auVar214._12_4_ = fVar92;
  fStack_7f0 = fVar92;
  _local_800 = auVar214;
  fStack_7ec = fVar92;
  fStack_7e8 = fVar92;
  fStack_7e4 = fVar92;
  auVar101 = vfmadd231ps_fma((undefined1  [16])aVar2,(undefined1  [16])aVar3,auVar214);
  auVar101 = vblendps_avx(auVar101,_DAT_01feba10,8);
  local_a20 = vsubps_avx(auVar137,auVar101);
  auVar245 = ZEXT1664(local_a20);
  local_a30 = vsubps_avx(auVar159,auVar101);
  local_a40 = vsubps_avx(auVar4,auVar101);
  _local_a50 = vsubps_avx(auVar5,auVar101);
  auVar101 = vmovshdup_avx(local_a20);
  local_1c0 = auVar101._0_8_;
  uStack_1b8 = local_1c0;
  uStack_1b0 = local_1c0;
  uStack_1a8 = local_1c0;
  auVar101 = vshufps_avx(local_a20,local_a20,0xaa);
  uVar93 = auVar101._0_8_;
  local_1a0._8_8_ = uVar93;
  local_1a0._0_8_ = uVar93;
  local_1a0._16_8_ = uVar93;
  local_1a0._24_8_ = uVar93;
  auVar101 = vshufps_avx(local_a20,local_a20,0xff);
  uVar93 = auVar101._0_8_;
  local_460._8_8_ = uVar93;
  local_460._0_8_ = uVar93;
  local_460._16_8_ = uVar93;
  local_460._24_8_ = uVar93;
  auVar101 = vmovshdup_avx(local_a40);
  uVar93 = auVar101._0_8_;
  auVar226._8_8_ = uVar93;
  auVar226._0_8_ = uVar93;
  auVar226._16_8_ = uVar93;
  auVar226._24_8_ = uVar93;
  auVar101 = vshufps_avx(local_a40,local_a40,0xaa);
  uVar93 = auVar101._0_8_;
  local_9a0._8_8_ = uVar93;
  local_9a0._0_8_ = uVar93;
  local_9a0._16_8_ = uVar93;
  local_9a0._24_8_ = uVar93;
  auVar101 = vshufps_avx(local_a40,local_a40,0xff);
  uVar93 = auVar101._0_8_;
  local_840._8_8_ = uVar93;
  local_840._0_8_ = uVar93;
  local_840._16_8_ = uVar93;
  local_840._24_8_ = uVar93;
  auVar101 = vmovshdup_avx(local_a30);
  uVar93 = auVar101._0_8_;
  local_2a0._8_8_ = uVar93;
  local_2a0._0_8_ = uVar93;
  local_2a0._16_8_ = uVar93;
  local_2a0._24_8_ = uVar93;
  auVar101 = vshufps_avx(local_a30,local_a30,0xaa);
  local_340 = auVar101._0_4_;
  fStack_33c = auVar101._4_4_;
  auVar101 = vshufps_avx(local_a30,local_a30,0xff);
  local_360 = auVar101._0_4_;
  fStack_35c = auVar101._4_4_;
  auVar101 = vmovshdup_avx(_local_a50);
  local_1e0 = auVar101._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar101 = vshufps_avx(_local_a50,_local_a50,0xaa);
  local_200 = auVar101._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar101 = vshufps_avx(_local_a50,_local_a50,0xff);
  local_220 = auVar101._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar96._0_4_ = aVar3.x * aVar3.x;
  auVar96._4_4_ = aVar3.y * aVar3.y;
  auVar96._8_4_ = aVar3.z * aVar3.z;
  auVar96._12_4_ = aVar3.field_3.w * aVar3.field_3.w;
  auVar101 = vshufps_avx(auVar96,auVar96,0xaa);
  uVar90 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
  local_6c0._4_4_ = uVar90;
  local_6c0._0_4_ = uVar90;
  fStack_6b8 = (float)uVar90;
  fStack_6b4 = (float)uVar90;
  fStack_6b0 = (float)uVar90;
  fStack_6ac = (float)uVar90;
  fStack_6a8 = (float)uVar90;
  register0x0000125c = uVar90;
  uVar93 = auVar101._0_8_;
  auVar249._8_8_ = uVar93;
  auVar249._0_8_ = uVar93;
  auVar249._16_8_ = uVar93;
  auVar249._24_8_ = uVar93;
  auVar101 = vfmadd231ps_fma(auVar249,_local_6c0,_local_6c0);
  uVar90 = *(undefined4 *)&(ray->dir).field_0;
  local_6a0._4_4_ = uVar90;
  local_6a0._0_4_ = uVar90;
  fStack_698 = (float)uVar90;
  fStack_694 = (float)uVar90;
  fStack_690 = (float)uVar90;
  fStack_68c = (float)uVar90;
  fStack_688 = (float)uVar90;
  register0x0000121c = uVar90;
  auVar101 = vfmadd231ps_fma(ZEXT1632(auVar101),_local_6a0,_local_6a0);
  auVar253 = ZEXT1664(auVar101);
  uVar91 = 1;
  uVar85 = 0;
  bVar86 = 0;
  local_480 = (ray->dir).field_0.m128[2];
  uVar90 = local_a20._0_4_;
  local_9e0._4_4_ = uVar90;
  local_9e0._0_4_ = uVar90;
  local_9e0._8_4_ = uVar90;
  local_9e0._12_4_ = uVar90;
  local_9e0._16_4_ = uVar90;
  local_9e0._20_4_ = uVar90;
  local_9e0._24_4_ = uVar90;
  local_9e0._28_4_ = uVar90;
  uVar90 = local_a40._0_4_;
  local_860._4_4_ = uVar90;
  local_860._0_4_ = uVar90;
  local_860._8_4_ = uVar90;
  local_860._12_4_ = uVar90;
  local_860._16_4_ = uVar90;
  local_860._20_4_ = uVar90;
  local_860._24_4_ = uVar90;
  local_860._28_4_ = uVar90;
  auVar243 = ZEXT3264(local_860);
  uVar90 = local_a30._0_4_;
  local_2c0._4_4_ = uVar90;
  local_2c0._0_4_ = uVar90;
  local_2c0._8_4_ = uVar90;
  local_2c0._12_4_ = uVar90;
  local_2c0._16_4_ = uVar90;
  local_2c0._20_4_ = uVar90;
  local_2c0._24_4_ = uVar90;
  local_2c0._28_4_ = uVar90;
  local_260 = local_a50._0_4_;
  fStack_25c = local_260;
  fStack_258 = local_260;
  fStack_254 = local_260;
  fStack_250 = local_260;
  fStack_24c = local_260;
  fStack_248 = local_260;
  fStack_244 = local_260;
  local_240 = ZEXT1632(auVar101);
  local_380 = vandps_avx(ZEXT1632(auVar101),local_720);
  local_740 = ZEXT816(0x3f80000000000000);
  local_980 = auVar226;
  fStack_47c = local_480;
  fStack_478 = local_480;
  fStack_474 = local_480;
  fStack_470 = local_480;
  fStack_46c = local_480;
  fStack_468 = local_480;
  fStack_464 = local_480;
  fStack_358 = local_360;
  fStack_354 = fStack_35c;
  fStack_350 = local_360;
  fStack_34c = fStack_35c;
  fStack_348 = local_360;
  fStack_344 = fStack_35c;
  fStack_338 = local_340;
  fStack_334 = fStack_33c;
  fStack_330 = local_340;
  fStack_32c = fStack_33c;
  fStack_328 = local_340;
  fStack_324 = fStack_33c;
  do {
    auVar101 = vmovshdup_avx(local_740);
    local_7e0._0_4_ = local_740._0_4_;
    fVar151 = auVar101._0_4_ - (float)local_7e0._0_4_;
    fVar155 = fVar151 * 0.04761905;
    local_7e0._4_4_ = (float)local_7e0._0_4_;
    local_7e0._8_4_ = (float)local_7e0._0_4_;
    local_7e0._12_4_ = (float)local_7e0._0_4_;
    local_7e0._16_4_ = local_7e0._0_4_;
    local_7e0._20_4_ = local_7e0._0_4_;
    local_7e0._24_4_ = local_7e0._0_4_;
    local_7e0._28_4_ = local_7e0._0_4_;
    local_880._4_4_ = fVar151;
    local_880._0_4_ = fVar151;
    local_880._8_4_ = fVar151;
    local_880._12_4_ = fVar151;
    local_880._16_4_ = fVar151;
    local_880._20_4_ = fVar151;
    local_880._24_4_ = fVar151;
    local_880._28_4_ = fVar151;
    auVar101 = vfmadd231ps_fma(local_7e0,local_880,_DAT_02020f20);
    auVar277._8_4_ = 0x3f800000;
    auVar277._0_8_ = &DAT_3f8000003f800000;
    auVar277._12_4_ = 0x3f800000;
    auVar277._16_4_ = 0x3f800000;
    auVar277._20_4_ = 0x3f800000;
    auVar277._24_4_ = 0x3f800000;
    auVar277._28_4_ = 0x3f800000;
    auVar113 = vsubps_avx(auVar277,ZEXT1632(auVar101));
    fVar92 = auVar101._0_4_;
    auVar254._0_4_ = auVar243._0_4_ * fVar92;
    fVar121 = auVar101._4_4_;
    auVar254._4_4_ = auVar243._4_4_ * fVar121;
    fVar150 = auVar101._8_4_;
    auVar254._8_4_ = auVar243._8_4_ * fVar150;
    fVar281 = auVar101._12_4_;
    auVar254._12_4_ = auVar243._12_4_ * fVar281;
    auVar254._16_4_ = auVar243._16_4_ * 0.0;
    auVar254._20_4_ = auVar243._20_4_ * 0.0;
    auVar254._28_36_ = auVar253._28_36_;
    auVar254._24_4_ = auVar243._24_4_ * 0.0;
    auVar253._0_4_ = auVar226._0_4_ * fVar92;
    auVar253._4_4_ = auVar226._4_4_ * fVar121;
    auVar253._8_4_ = auVar226._8_4_ * fVar150;
    auVar253._12_4_ = auVar226._12_4_ * fVar281;
    auVar253._16_4_ = auVar226._16_4_ * 0.0;
    auVar253._20_4_ = auVar226._20_4_ * 0.0;
    auVar253._28_36_ = auVar245._28_36_;
    auVar253._24_4_ = auVar226._24_4_ * 0.0;
    auVar23._4_4_ = local_9a0._4_4_ * fVar121;
    auVar23._0_4_ = local_9a0._0_4_ * fVar92;
    auVar23._8_4_ = local_9a0._8_4_ * fVar150;
    auVar23._12_4_ = local_9a0._12_4_ * fVar281;
    auVar23._16_4_ = local_9a0._16_4_ * 0.0;
    auVar23._20_4_ = local_9a0._20_4_ * 0.0;
    auVar23._24_4_ = local_9a0._24_4_ * 0.0;
    auVar23._28_4_ = 0x3f800000;
    auVar24._4_4_ = local_840._4_4_ * fVar121;
    auVar24._0_4_ = local_840._0_4_ * fVar92;
    auVar24._8_4_ = local_840._8_4_ * fVar150;
    auVar24._12_4_ = local_840._12_4_ * fVar281;
    auVar24._16_4_ = local_840._16_4_ * 0.0;
    auVar24._20_4_ = local_840._20_4_ * 0.0;
    auVar24._24_4_ = local_840._24_4_ * 0.0;
    auVar24._28_4_ = fVar151;
    auVar101 = vfmadd231ps_fma(auVar254._0_32_,auVar113,local_9e0);
    auVar83._8_8_ = uStack_1b8;
    auVar83._0_8_ = local_1c0;
    auVar83._16_8_ = uStack_1b0;
    auVar83._24_8_ = uStack_1a8;
    auVar201 = vfmadd231ps_fma(auVar253._0_32_,auVar113,auVar83);
    auVar238 = vfmadd231ps_fma(auVar23,auVar113,local_1a0);
    auVar137 = vfmadd231ps_fma(auVar24,auVar113,local_460);
    auVar71._4_4_ = local_2c0._4_4_ * fVar121;
    auVar71._0_4_ = local_2c0._0_4_ * fVar92;
    auVar71._8_4_ = local_2c0._8_4_ * fVar150;
    auVar71._12_4_ = local_2c0._12_4_ * fVar281;
    auVar71._16_4_ = local_2c0._16_4_ * 0.0;
    auVar71._20_4_ = local_2c0._20_4_ * 0.0;
    auVar71._24_4_ = local_2c0._24_4_ * 0.0;
    auVar71._28_4_ = local_9e0._28_4_;
    auVar25._4_4_ = local_2a0._4_4_ * fVar121;
    auVar25._0_4_ = local_2a0._0_4_ * fVar92;
    auVar25._8_4_ = local_2a0._8_4_ * fVar150;
    auVar25._12_4_ = local_2a0._12_4_ * fVar281;
    auVar25._16_4_ = local_2a0._16_4_ * 0.0;
    auVar25._20_4_ = local_2a0._20_4_ * 0.0;
    auVar25._24_4_ = local_2a0._24_4_ * 0.0;
    auVar25._28_4_ = local_2c0._28_4_;
    auVar74._4_4_ = fVar121 * fStack_33c;
    auVar74._0_4_ = fVar92 * local_340;
    auVar74._8_4_ = fVar150 * fStack_338;
    auVar74._12_4_ = fVar281 * fStack_334;
    auVar74._16_4_ = fStack_330 * 0.0;
    auVar74._20_4_ = fStack_32c * 0.0;
    auVar74._24_4_ = fStack_328 * 0.0;
    auVar74._28_4_ = local_460._28_4_;
    auVar26._4_4_ = fVar121 * fStack_35c;
    auVar26._0_4_ = fVar92 * local_360;
    auVar26._8_4_ = fVar150 * fStack_358;
    auVar26._12_4_ = fVar281 * fStack_354;
    auVar26._16_4_ = fStack_350 * 0.0;
    auVar26._20_4_ = fStack_34c * 0.0;
    auVar26._24_4_ = fStack_348 * 0.0;
    auVar26._28_4_ = local_1a0._28_4_;
    auVar4 = vfmadd231ps_fma(auVar71,auVar113,auVar243._0_32_);
    auVar159 = vfmadd231ps_fma(auVar25,auVar113,auVar226);
    auVar5 = vfmadd231ps_fma(auVar74,auVar113,local_9a0);
    auVar6 = vfmadd231ps_fma(auVar26,auVar113,local_840);
    auVar269._0_4_ = fVar92 * local_260;
    auVar269._4_4_ = fVar121 * fStack_25c;
    auVar269._8_4_ = fVar150 * fStack_258;
    auVar269._12_4_ = fVar281 * fStack_254;
    auVar269._16_4_ = fStack_250 * 0.0;
    auVar269._20_4_ = fStack_24c * 0.0;
    auVar269._28_36_ = auVar268._28_36_;
    auVar269._24_4_ = fStack_248 * 0.0;
    auVar27._4_4_ = fVar121 * local_1e0._4_4_;
    auVar27._0_4_ = fVar92 * (float)local_1e0;
    auVar27._8_4_ = fVar150 * (float)uStack_1d8;
    auVar27._12_4_ = fVar281 * uStack_1d8._4_4_;
    auVar27._16_4_ = (float)uStack_1d0 * 0.0;
    auVar27._20_4_ = uStack_1d0._4_4_ * 0.0;
    auVar27._24_4_ = (float)uStack_1c8 * 0.0;
    auVar27._28_4_ = local_840._28_4_;
    auVar28._28_4_ = auVar226._28_4_;
    auVar28._0_28_ =
         ZEXT1628(CONCAT412(auVar4._12_4_ * fVar281,
                            CONCAT48(auVar4._8_4_ * fVar150,
                                     CONCAT44(auVar4._4_4_ * fVar121,auVar4._0_4_ * fVar92))));
    auVar101 = vfmadd231ps_fma(auVar28,auVar113,ZEXT1632(auVar101));
    auVar201 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar281 * auVar159._12_4_,
                                                  CONCAT48(fVar150 * auVar159._8_4_,
                                                           CONCAT44(fVar121 * auVar159._4_4_,
                                                                    fVar92 * auVar159._0_4_)))),
                               auVar113,ZEXT1632(auVar201));
    auVar238 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar281 * auVar5._12_4_,
                                                  CONCAT48(fVar150 * auVar5._8_4_,
                                                           CONCAT44(fVar121 * auVar5._4_4_,
                                                                    fVar92 * auVar5._0_4_)))),
                               auVar113,ZEXT1632(auVar238));
    auVar245._28_36_ = auVar243._28_36_;
    auVar245._0_28_ =
         ZEXT1628(CONCAT412(fVar281 * auVar6._12_4_,
                            CONCAT48(fVar150 * auVar6._8_4_,
                                     CONCAT44(fVar121 * auVar6._4_4_,fVar92 * auVar6._0_4_))));
    auVar137 = vfmadd231ps_fma(auVar245._0_32_,auVar113,ZEXT1632(auVar137));
    auVar29._4_4_ = fVar121 * local_200._4_4_;
    auVar29._0_4_ = fVar92 * (float)local_200;
    auVar29._8_4_ = fVar150 * (float)uStack_1f8;
    auVar29._12_4_ = fVar281 * uStack_1f8._4_4_;
    auVar29._16_4_ = (float)uStack_1f0 * 0.0;
    auVar29._20_4_ = uStack_1f0._4_4_ * 0.0;
    auVar29._24_4_ = (float)uStack_1e8 * 0.0;
    auVar29._28_4_ = local_9a0._28_4_;
    auVar7 = vfmadd231ps_fma(auVar269._0_32_,auVar113,local_2c0);
    auVar4 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar7._12_4_ * fVar281,
                                                CONCAT48(auVar7._8_4_ * fVar150,
                                                         CONCAT44(auVar7._4_4_ * fVar121,
                                                                  auVar7._0_4_ * fVar92)))),auVar113
                             ,ZEXT1632(auVar4));
    auVar236._0_4_ = fVar92 * (float)local_220;
    auVar236._4_4_ = fVar121 * local_220._4_4_;
    auVar236._8_4_ = fVar150 * (float)uStack_218;
    auVar236._12_4_ = fVar281 * uStack_218._4_4_;
    auVar236._16_4_ = (float)uStack_210 * 0.0;
    auVar236._20_4_ = uStack_210._4_4_ * 0.0;
    auVar236._24_4_ = (float)uStack_208 * 0.0;
    auVar236._28_4_ = 0;
    auVar7 = vfmadd231ps_fma(auVar27,auVar113,local_2a0);
    auVar82._4_4_ = fStack_33c;
    auVar82._0_4_ = local_340;
    auVar82._8_4_ = fStack_338;
    auVar82._12_4_ = fStack_334;
    auVar82._16_4_ = fStack_330;
    auVar82._20_4_ = fStack_32c;
    auVar82._24_4_ = fStack_328;
    auVar82._28_4_ = fStack_324;
    auVar94 = vfmadd231ps_fma(auVar29,auVar113,auVar82);
    auVar81._4_4_ = fStack_35c;
    auVar81._0_4_ = local_360;
    auVar81._8_4_ = fStack_358;
    auVar81._12_4_ = fStack_354;
    auVar81._16_4_ = fStack_350;
    auVar81._20_4_ = fStack_34c;
    auVar81._24_4_ = fStack_348;
    auVar81._28_4_ = fStack_344;
    auVar156 = vfmadd231ps_fma(auVar236,auVar113,auVar81);
    auVar30._28_4_ = local_2a0._28_4_;
    auVar30._0_28_ =
         ZEXT1628(CONCAT412(auVar156._12_4_ * fVar281,
                            CONCAT48(auVar156._8_4_ * fVar150,
                                     CONCAT44(auVar156._4_4_ * fVar121,auVar156._0_4_ * fVar92))));
    auVar159 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar7._12_4_ * fVar281,
                                                  CONCAT48(auVar7._8_4_ * fVar150,
                                                           CONCAT44(auVar7._4_4_ * fVar121,
                                                                    auVar7._0_4_ * fVar92)))),
                               auVar113,ZEXT1632(auVar159));
    auVar5 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar281 * auVar94._12_4_,
                                                CONCAT48(fVar150 * auVar94._8_4_,
                                                         CONCAT44(fVar121 * auVar94._4_4_,
                                                                  fVar92 * auVar94._0_4_)))),
                             auVar113,ZEXT1632(auVar5));
    auVar6 = vfmadd231ps_fma(auVar30,auVar113,ZEXT1632(auVar6));
    auVar31._28_4_ = local_2c0._28_4_;
    auVar31._0_28_ =
         ZEXT1628(CONCAT412(auVar159._12_4_ * fVar281,
                            CONCAT48(auVar159._8_4_ * fVar150,
                                     CONCAT44(auVar159._4_4_ * fVar121,auVar159._0_4_ * fVar92))));
    auVar7 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar4._12_4_ * fVar281,
                                                CONCAT48(auVar4._8_4_ * fVar150,
                                                         CONCAT44(auVar4._4_4_ * fVar121,
                                                                  auVar4._0_4_ * fVar92)))),auVar113
                             ,ZEXT1632(auVar101));
    auVar94 = vfmadd231ps_fma(auVar31,auVar113,ZEXT1632(auVar201));
    auVar104 = ZEXT1632(auVar94);
    auVar94 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar281 * auVar5._12_4_,
                                                 CONCAT48(fVar150 * auVar5._8_4_,
                                                          CONCAT44(fVar121 * auVar5._4_4_,
                                                                   fVar92 * auVar5._0_4_)))),
                              auVar113,ZEXT1632(auVar238));
    auVar156 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar6._12_4_ * fVar281,
                                                  CONCAT48(auVar6._8_4_ * fVar150,
                                                           CONCAT44(auVar6._4_4_ * fVar121,
                                                                    auVar6._0_4_ * fVar92)))),
                               ZEXT1632(auVar137),auVar113);
    auVar17 = vsubps_avx(ZEXT1632(auVar4),ZEXT1632(auVar101));
    auVar113 = vsubps_avx(ZEXT1632(auVar159),ZEXT1632(auVar201));
    auVar18 = vsubps_avx(ZEXT1632(auVar5),ZEXT1632(auVar238));
    auVar19 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar137));
    local_7c0._0_4_ = fVar155 * auVar17._0_4_ * 3.0;
    local_7c0._4_4_ = fVar155 * auVar17._4_4_ * 3.0;
    fStack_7b8 = fVar155 * auVar17._8_4_ * 3.0;
    fStack_7b4 = fVar155 * auVar17._12_4_ * 3.0;
    register0x00001550 = fVar155 * auVar17._16_4_ * 3.0;
    register0x00001554 = fVar155 * auVar17._20_4_ * 3.0;
    register0x00001558 = fVar155 * auVar17._24_4_ * 3.0;
    register0x0000155c = 0;
    local_9c0._0_4_ = fVar155 * auVar113._0_4_ * 3.0;
    local_9c0._4_4_ = fVar155 * auVar113._4_4_ * 3.0;
    local_9c0._8_4_ = fVar155 * auVar113._8_4_ * 3.0;
    local_9c0._12_4_ = fVar155 * auVar113._12_4_ * 3.0;
    local_9c0._16_4_ = fVar155 * auVar113._16_4_ * 3.0;
    local_9c0._20_4_ = fVar155 * auVar113._20_4_ * 3.0;
    local_9c0._24_4_ = fVar155 * auVar113._24_4_ * 3.0;
    local_9c0._28_4_ = 0;
    local_5e0._0_4_ = fVar155 * auVar18._0_4_ * 3.0;
    local_5e0._4_4_ = fVar155 * auVar18._4_4_ * 3.0;
    local_5e0._8_4_ = fVar155 * auVar18._8_4_ * 3.0;
    local_5e0._12_4_ = fVar155 * auVar18._12_4_ * 3.0;
    local_5e0._16_4_ = fVar155 * auVar18._16_4_ * 3.0;
    local_5e0._20_4_ = fVar155 * auVar18._20_4_ * 3.0;
    local_5e0._24_4_ = fVar155 * auVar18._24_4_ * 3.0;
    local_5e0._28_4_ = 0;
    fVar121 = fVar155 * auVar19._0_4_ * 3.0;
    fVar150 = fVar155 * auVar19._4_4_ * 3.0;
    auVar32._4_4_ = fVar150;
    auVar32._0_4_ = fVar121;
    fVar151 = fVar155 * auVar19._8_4_ * 3.0;
    auVar32._8_4_ = fVar151;
    fVar152 = fVar155 * auVar19._12_4_ * 3.0;
    auVar32._12_4_ = fVar152;
    fVar153 = fVar155 * auVar19._16_4_ * 3.0;
    auVar32._16_4_ = fVar153;
    fVar154 = fVar155 * auVar19._20_4_ * 3.0;
    auVar32._20_4_ = fVar154;
    fVar155 = fVar155 * auVar19._24_4_ * 3.0;
    auVar32._24_4_ = fVar155;
    auVar32._28_4_ = auVar17._28_4_;
    local_ac0 = ZEXT1632(auVar7);
    auVar21 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar7));
    local_780 = vpermps_avx2(_DAT_0205d4a0,auVar104);
    local_7a0 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar94));
    auVar20 = vsubps_avx(auVar21,local_ac0);
    auVar167 = vsubps_avx(local_7a0,ZEXT1632(auVar94));
    fVar171 = auVar167._0_4_;
    fVar172 = auVar167._4_4_;
    auVar33._4_4_ = fVar172 * (float)local_7c0._4_4_;
    auVar33._0_4_ = fVar171 * (float)local_7c0._0_4_;
    fVar173 = auVar167._8_4_;
    auVar33._8_4_ = fVar173 * fStack_7b8;
    fVar174 = auVar167._12_4_;
    auVar33._12_4_ = fVar174 * fStack_7b4;
    fVar211 = auVar167._16_4_;
    auVar33._16_4_ = fVar211 * register0x00001550;
    fVar212 = auVar167._20_4_;
    auVar33._20_4_ = fVar212 * register0x00001554;
    fVar244 = auVar167._24_4_;
    auVar33._24_4_ = fVar244 * register0x00001558;
    auVar33._28_4_ = local_7a0._28_4_;
    auVar101 = vfmsub231ps_fma(auVar33,local_5e0,auVar20);
    auVar194 = vsubps_avx(local_780,auVar104);
    fVar246 = auVar20._0_4_;
    fVar247 = auVar20._4_4_;
    auVar34._4_4_ = fVar247 * local_9c0._4_4_;
    auVar34._0_4_ = fVar246 * local_9c0._0_4_;
    fVar248 = auVar20._8_4_;
    auVar34._8_4_ = fVar248 * local_9c0._8_4_;
    fVar257 = auVar20._12_4_;
    auVar34._12_4_ = fVar257 * local_9c0._12_4_;
    fVar262 = auVar20._16_4_;
    auVar34._16_4_ = fVar262 * local_9c0._16_4_;
    fVar255 = auVar20._20_4_;
    auVar34._20_4_ = fVar255 * local_9c0._20_4_;
    fVar256 = auVar20._24_4_;
    auVar34._24_4_ = fVar256 * local_9c0._24_4_;
    auVar34._28_4_ = auVar21._28_4_;
    auVar201 = vfmsub231ps_fma(auVar34,_local_7c0,auVar194);
    auVar101 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar201._12_4_ * auVar201._12_4_,
                                                  CONCAT48(auVar201._8_4_ * auVar201._8_4_,
                                                           CONCAT44(auVar201._4_4_ * auVar201._4_4_,
                                                                    auVar201._0_4_ * auVar201._0_4_)
                                                          ))),ZEXT1632(auVar101),ZEXT1632(auVar101))
    ;
    fVar196 = auVar194._0_4_;
    fVar207 = auVar194._4_4_;
    auVar35._4_4_ = fVar207 * local_5e0._4_4_;
    auVar35._0_4_ = fVar196 * local_5e0._0_4_;
    fVar208 = auVar194._8_4_;
    auVar35._8_4_ = fVar208 * local_5e0._8_4_;
    fVar209 = auVar194._12_4_;
    auVar35._12_4_ = fVar209 * local_5e0._12_4_;
    fVar210 = auVar194._16_4_;
    auVar35._16_4_ = fVar210 * local_5e0._16_4_;
    fVar263 = auVar194._20_4_;
    auVar35._20_4_ = fVar263 * local_5e0._20_4_;
    fVar264 = auVar194._24_4_;
    auVar35._24_4_ = fVar264 * local_5e0._24_4_;
    auVar35._28_4_ = local_780._28_4_;
    auVar238 = vfmsub231ps_fma(auVar35,local_9c0,auVar167);
    auVar190._0_4_ = fVar171 * fVar171;
    auVar190._4_4_ = fVar172 * fVar172;
    auVar190._8_4_ = fVar173 * fVar173;
    auVar190._12_4_ = fVar174 * fVar174;
    auVar190._16_4_ = fVar211 * fVar211;
    auVar190._20_4_ = fVar212 * fVar212;
    auVar190._24_4_ = fVar244 * fVar244;
    auVar190._28_4_ = 0;
    auVar201 = vfmadd231ps_fma(auVar190,auVar194,auVar194);
    auVar201 = vfmadd231ps_fma(ZEXT1632(auVar201),auVar20,auVar20);
    auVar113 = vrcpps_avx(ZEXT1632(auVar201));
    auVar238 = vfmadd231ps_fma(ZEXT1632(auVar101),ZEXT1632(auVar238),ZEXT1632(auVar238));
    auVar242._8_4_ = 0x3f800000;
    auVar242._0_8_ = &DAT_3f8000003f800000;
    auVar242._12_4_ = 0x3f800000;
    auVar242._16_4_ = 0x3f800000;
    auVar242._20_4_ = 0x3f800000;
    auVar242._24_4_ = 0x3f800000;
    auVar242._28_4_ = 0x3f800000;
    auVar101 = vfnmadd213ps_fma(auVar113,ZEXT1632(auVar201),auVar242);
    auVar101 = vfmadd132ps_fma(ZEXT1632(auVar101),auVar113,auVar113);
    local_a80 = vpermps_avx2(_DAT_0205d4a0,_local_7c0);
    local_900 = vpermps_avx2(_DAT_0205d4a0,local_5e0);
    auVar36._4_4_ = fVar172 * local_a80._4_4_;
    auVar36._0_4_ = fVar171 * local_a80._0_4_;
    auVar36._8_4_ = fVar173 * local_a80._8_4_;
    auVar36._12_4_ = fVar174 * local_a80._12_4_;
    auVar36._16_4_ = fVar211 * local_a80._16_4_;
    auVar36._20_4_ = fVar212 * local_a80._20_4_;
    auVar36._24_4_ = fVar244 * local_a80._24_4_;
    auVar36._28_4_ = auVar113._28_4_;
    auVar137 = vfmsub231ps_fma(auVar36,local_900,auVar20);
    local_920 = vpermps_avx2(_DAT_0205d4a0,local_9c0);
    auVar37._4_4_ = fVar247 * local_920._4_4_;
    auVar37._0_4_ = fVar246 * local_920._0_4_;
    auVar37._8_4_ = fVar248 * local_920._8_4_;
    auVar37._12_4_ = fVar257 * local_920._12_4_;
    auVar37._16_4_ = fVar262 * local_920._16_4_;
    auVar37._20_4_ = fVar255 * local_920._20_4_;
    auVar37._24_4_ = fVar256 * local_920._24_4_;
    auVar37._28_4_ = 0;
    auVar4 = vfmsub231ps_fma(auVar37,local_a80,auVar194);
    auVar137 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar4._12_4_ * auVar4._12_4_,
                                                  CONCAT48(auVar4._8_4_ * auVar4._8_4_,
                                                           CONCAT44(auVar4._4_4_ * auVar4._4_4_,
                                                                    auVar4._0_4_ * auVar4._0_4_)))),
                               ZEXT1632(auVar137),ZEXT1632(auVar137));
    fVar92 = local_900._0_4_;
    auVar219._0_4_ = fVar196 * fVar92;
    fVar281 = local_900._4_4_;
    auVar219._4_4_ = fVar207 * fVar281;
    fVar282 = local_900._8_4_;
    auVar219._8_4_ = fVar208 * fVar282;
    fVar283 = local_900._12_4_;
    auVar219._12_4_ = fVar209 * fVar283;
    fVar14 = local_900._16_4_;
    auVar219._16_4_ = fVar210 * fVar14;
    fVar15 = local_900._20_4_;
    auVar219._20_4_ = fVar263 * fVar15;
    fVar16 = local_900._24_4_;
    auVar219._24_4_ = fVar264 * fVar16;
    auVar219._28_4_ = 0;
    auVar4 = vfmsub231ps_fma(auVar219,local_920,auVar167);
    auVar137 = vfmadd231ps_fma(ZEXT1632(auVar137),ZEXT1632(auVar4),ZEXT1632(auVar4));
    auVar113 = vmaxps_avx(ZEXT1632(CONCAT412(auVar238._12_4_ * auVar101._12_4_,
                                             CONCAT48(auVar238._8_4_ * auVar101._8_4_,
                                                      CONCAT44(auVar238._4_4_ * auVar101._4_4_,
                                                               auVar238._0_4_ * auVar101._0_4_)))),
                          ZEXT1632(CONCAT412(auVar137._12_4_ * auVar101._12_4_,
                                             CONCAT48(auVar137._8_4_ * auVar101._8_4_,
                                                      CONCAT44(auVar137._4_4_ * auVar101._4_4_,
                                                               auVar137._0_4_ * auVar101._0_4_)))));
    local_8c0._0_4_ = auVar156._0_4_ + fVar121;
    local_8c0._4_4_ = auVar156._4_4_ + fVar150;
    fStack_8b8 = auVar156._8_4_ + fVar151;
    fStack_8b4 = auVar156._12_4_ + fVar152;
    fStack_8b0 = fVar153 + 0.0;
    fStack_8ac = fVar154 + 0.0;
    fStack_8a8 = fVar155 + 0.0;
    fStack_8a4 = auVar17._28_4_ + 0.0;
    auVar163 = ZEXT1632(auVar156);
    local_8a0._16_16_ = (undefined1  [16])0x0;
    auVar17 = vsubps_avx(auVar163,auVar32);
    local_600 = vpermps_avx2(_DAT_0205d4a0,auVar17);
    local_820 = vpermps_avx2(_DAT_0205d4a0,auVar163);
    auVar17 = vmaxps_avx(auVar163,_local_8c0);
    auVar18 = vmaxps_avx(local_600,local_820);
    auVar19 = vrsqrtps_avx(ZEXT1632(auVar201));
    auVar17 = vmaxps_avx(auVar17,auVar18);
    fVar121 = auVar19._0_4_;
    fVar150 = auVar19._4_4_;
    fVar155 = auVar19._8_4_;
    fVar151 = auVar19._12_4_;
    fVar152 = auVar19._16_4_;
    fVar153 = auVar19._20_4_;
    fVar154 = auVar19._24_4_;
    auVar38._4_4_ = fVar150 * fVar150 * fVar150 * auVar201._4_4_ * -0.5;
    auVar38._0_4_ = fVar121 * fVar121 * fVar121 * auVar201._0_4_ * -0.5;
    auVar38._8_4_ = fVar155 * fVar155 * fVar155 * auVar201._8_4_ * -0.5;
    auVar38._12_4_ = fVar151 * fVar151 * fVar151 * auVar201._12_4_ * -0.5;
    auVar38._16_4_ = fVar152 * fVar152 * fVar152 * -0.0;
    auVar38._20_4_ = fVar153 * fVar153 * fVar153 * -0.0;
    auVar38._24_4_ = fVar154 * fVar154 * fVar154 * -0.0;
    auVar38._28_4_ = local_920._28_4_;
    auVar105._8_4_ = 0x3fc00000;
    auVar105._0_8_ = 0x3fc000003fc00000;
    auVar105._12_4_ = 0x3fc00000;
    auVar105._16_4_ = 0x3fc00000;
    auVar105._20_4_ = 0x3fc00000;
    auVar105._24_4_ = 0x3fc00000;
    auVar105._28_4_ = 0x3fc00000;
    auVar101 = vfmadd231ps_fma(auVar38,auVar105,auVar19);
    auVar268 = ZEXT1664(auVar101);
    fVar121 = auVar101._0_4_;
    fVar155 = auVar101._4_4_;
    auVar39._4_4_ = fVar207 * fVar155;
    auVar39._0_4_ = fVar196 * fVar121;
    fVar152 = auVar101._8_4_;
    auVar39._8_4_ = fVar208 * fVar152;
    fVar154 = auVar101._12_4_;
    auVar39._12_4_ = fVar209 * fVar154;
    auVar39._16_4_ = fVar210 * 0.0;
    auVar39._20_4_ = fVar263 * 0.0;
    auVar39._24_4_ = fVar264 * 0.0;
    auVar39._28_4_ = 0;
    auVar40._4_4_ = fStack_47c * fVar172 * fVar155;
    auVar40._0_4_ = local_480 * fVar171 * fVar121;
    auVar40._8_4_ = fStack_478 * fVar173 * fVar152;
    auVar40._12_4_ = fStack_474 * fVar174 * fVar154;
    auVar40._16_4_ = fStack_470 * fVar211 * 0.0;
    auVar40._20_4_ = fStack_46c * fVar212 * 0.0;
    auVar40._24_4_ = fStack_468 * fVar244 * 0.0;
    auVar40._28_4_ = auVar167._28_4_;
    auVar101 = vfmadd231ps_fma(auVar40,auVar39,_local_6c0);
    auVar234 = ZEXT1632(auVar94);
    auVar106 = ZEXT1232(ZEXT812(0)) << 0x20;
    auVar18 = vsubps_avx(auVar106,auVar234);
    fVar196 = auVar18._0_4_;
    auVar270._0_4_ = fVar196 * fVar171 * fVar121;
    fVar207 = auVar18._4_4_;
    auVar270._4_4_ = fVar207 * fVar172 * fVar155;
    fVar208 = auVar18._8_4_;
    auVar270._8_4_ = fVar208 * fVar173 * fVar152;
    fVar209 = auVar18._12_4_;
    auVar270._12_4_ = fVar209 * fVar174 * fVar154;
    fVar210 = auVar18._16_4_;
    auVar270._16_4_ = fVar210 * fVar211 * 0.0;
    fVar211 = auVar18._20_4_;
    auVar270._20_4_ = fVar211 * fVar212 * 0.0;
    fVar212 = auVar18._24_4_;
    auVar270._24_4_ = fVar212 * fVar244 * 0.0;
    auVar270._28_4_ = 0;
    auVar106 = vsubps_avx(auVar106,auVar104);
    auVar201 = vfmadd231ps_fma(auVar270,auVar106,auVar39);
    auVar41._4_4_ = fVar247 * fVar155;
    auVar41._0_4_ = fVar246 * fVar121;
    auVar41._8_4_ = fVar248 * fVar152;
    auVar41._12_4_ = fVar257 * fVar154;
    auVar41._16_4_ = fVar262 * 0.0;
    auVar41._20_4_ = fVar255 * 0.0;
    auVar41._24_4_ = fVar256 * 0.0;
    auVar41._28_4_ = auVar19._28_4_;
    auVar101 = vfmadd231ps_fma(ZEXT1632(auVar101),auVar41,_local_6a0);
    auVar107 = ZEXT1232(ZEXT812(0)) << 0x20;
    auVar227 = vsubps_avx(auVar107,local_ac0);
    auVar201 = vfmadd231ps_fma(ZEXT1632(auVar201),auVar227,auVar41);
    auVar42._4_4_ = fStack_47c * fVar207;
    auVar42._0_4_ = local_480 * fVar196;
    auVar42._8_4_ = fStack_478 * fVar208;
    auVar42._12_4_ = fStack_474 * fVar209;
    auVar42._16_4_ = fStack_470 * fVar210;
    auVar42._20_4_ = fStack_46c * fVar211;
    auVar42._24_4_ = fStack_468 * fVar212;
    auVar42._28_4_ = auVar19._28_4_;
    auVar238 = vfmadd231ps_fma(auVar42,_local_6c0,auVar106);
    auVar238 = vfmadd231ps_fma(ZEXT1632(auVar238),_local_6a0,auVar227);
    fVar150 = auVar201._0_4_;
    fVar244 = auVar101._0_4_;
    fVar151 = auVar201._4_4_;
    fVar246 = auVar101._4_4_;
    fVar153 = auVar201._8_4_;
    fVar247 = auVar101._8_4_;
    fVar171 = auVar201._12_4_;
    fVar248 = auVar101._12_4_;
    auVar43._28_4_ = local_6a0._28_4_;
    auVar43._0_28_ =
         ZEXT1628(CONCAT412(fVar248 * fVar171,
                            CONCAT48(fVar247 * fVar153,CONCAT44(fVar246 * fVar151,fVar244 * fVar150)
                                    )));
    auVar19 = vsubps_avx(ZEXT1632(auVar238),auVar43);
    auVar44._4_4_ = fVar207 * fVar207;
    auVar44._0_4_ = fVar196 * fVar196;
    auVar44._8_4_ = fVar208 * fVar208;
    auVar44._12_4_ = fVar209 * fVar209;
    auVar44._16_4_ = fVar210 * fVar210;
    auVar44._20_4_ = fVar211 * fVar211;
    auVar44._24_4_ = fVar212 * fVar212;
    auVar44._28_4_ = local_6a0._28_4_;
    auVar238 = vfmadd231ps_fma(auVar44,auVar106,auVar106);
    auVar238 = vfmadd231ps_fma(ZEXT1632(auVar238),auVar227,auVar227);
    auVar45._28_4_ = auVar20._28_4_;
    auVar45._0_28_ =
         ZEXT1628(CONCAT412(fVar171 * fVar171,
                            CONCAT48(fVar153 * fVar153,CONCAT44(fVar151 * fVar151,fVar150 * fVar150)
                                    )));
    local_620 = vsubps_avx(ZEXT1632(auVar238),auVar45);
    _local_660 = vsqrtps_avx(auVar113);
    fVar150 = (auVar17._0_4_ + local_660._0_4_) * 1.0000002;
    fVar151 = (auVar17._4_4_ + local_660._4_4_) * 1.0000002;
    fVar153 = (auVar17._8_4_ + local_660._8_4_) * 1.0000002;
    fVar171 = (auVar17._12_4_ + local_660._12_4_) * 1.0000002;
    fVar172 = (auVar17._16_4_ + local_660._16_4_) * 1.0000002;
    fVar173 = (auVar17._20_4_ + local_660._20_4_) * 1.0000002;
    fVar174 = (auVar17._24_4_ + local_660._24_4_) * 1.0000002;
    auVar46._4_4_ = fVar151 * fVar151;
    auVar46._0_4_ = fVar150 * fVar150;
    auVar46._8_4_ = fVar153 * fVar153;
    auVar46._12_4_ = fVar171 * fVar171;
    auVar46._16_4_ = fVar172 * fVar172;
    auVar46._20_4_ = fVar173 * fVar173;
    auVar46._24_4_ = fVar174 * fVar174;
    auVar46._28_4_ = auVar17._28_4_ + local_660._28_4_;
    fVar257 = auVar19._0_4_ + auVar19._0_4_;
    fVar262 = auVar19._4_4_ + auVar19._4_4_;
    auVar259._0_8_ = CONCAT44(fVar262,fVar257);
    auVar259._8_4_ = auVar19._8_4_ + auVar19._8_4_;
    auVar259._12_4_ = auVar19._12_4_ + auVar19._12_4_;
    auVar259._16_4_ = auVar19._16_4_ + auVar19._16_4_;
    auVar259._20_4_ = auVar19._20_4_ + auVar19._20_4_;
    auVar259._24_4_ = auVar19._24_4_ + auVar19._24_4_;
    auVar259._28_4_ = auVar19._28_4_ + auVar19._28_4_;
    auVar19 = vsubps_avx(local_620,auVar46);
    auVar230 = ZEXT1632(auVar101);
    auVar47._28_4_ = auVar17._28_4_;
    auVar47._0_28_ =
         ZEXT1628(CONCAT412(fVar248 * fVar248,
                            CONCAT48(fVar247 * fVar247,CONCAT44(fVar246 * fVar246,fVar244 * fVar244)
                                    )));
    local_ae0 = vsubps_avx(local_240,auVar47);
    local_640._4_4_ = fVar262 * fVar262;
    local_640._0_4_ = fVar257 * fVar257;
    local_640._8_4_ = auVar259._8_4_ * auVar259._8_4_;
    local_640._12_4_ = auVar259._12_4_ * auVar259._12_4_;
    local_640._16_4_ = auVar259._16_4_ * auVar259._16_4_;
    local_640._20_4_ = auVar259._20_4_ * auVar259._20_4_;
    local_640._24_4_ = auVar259._24_4_ * auVar259._24_4_;
    local_640._28_4_ = 0x3f800002;
    fVar150 = local_ae0._0_4_;
    local_680._0_4_ = fVar150 * 4.0;
    fVar151 = local_ae0._4_4_;
    local_680._4_4_ = fVar151 * 4.0;
    fVar153 = local_ae0._8_4_;
    fStack_678 = fVar153 * 4.0;
    fVar171 = local_ae0._12_4_;
    fStack_674 = fVar171 * 4.0;
    fVar172 = local_ae0._16_4_;
    fStack_670 = fVar172 * 4.0;
    fVar173 = local_ae0._20_4_;
    fStack_66c = fVar173 * 4.0;
    fVar174 = local_ae0._24_4_;
    fStack_668 = fVar174 * 4.0;
    uStack_664 = 0x40800000;
    auVar48._4_4_ = auVar19._4_4_ * (float)local_680._4_4_;
    auVar48._0_4_ = auVar19._0_4_ * (float)local_680._0_4_;
    auVar48._8_4_ = auVar19._8_4_ * fStack_678;
    auVar48._12_4_ = auVar19._12_4_ * fStack_674;
    auVar48._16_4_ = auVar19._16_4_ * fStack_670;
    auVar48._20_4_ = auVar19._20_4_ * fStack_66c;
    auVar48._24_4_ = auVar19._24_4_ * fStack_668;
    auVar48._28_4_ = 0x40800000;
    auVar17 = vsubps_avx(local_640,auVar48);
    auVar113 = vcmpps_avx(auVar17,auVar107,5);
    auVar233 = ZEXT1632(auVar201);
    if ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar113 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar113 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar113 >> 0x7f,0) == '\0') &&
          (auVar113 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar113 >> 0xbf,0) == '\0') &&
        (auVar113 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar113[0x1f])
    {
      auVar250._8_4_ = 0x7f800000;
      auVar250._0_8_ = 0x7f8000007f800000;
      auVar250._12_4_ = 0x7f800000;
      auVar250._16_4_ = 0x7f800000;
      auVar250._20_4_ = 0x7f800000;
      auVar250._24_4_ = 0x7f800000;
      auVar250._28_4_ = 0x7f800000;
      auVar260._8_4_ = 0xff800000;
      auVar260._0_8_ = 0xff800000ff800000;
      auVar260._12_4_ = 0xff800000;
      auVar260._16_4_ = 0xff800000;
      auVar260._20_4_ = 0xff800000;
      auVar260._24_4_ = 0xff800000;
      auVar260._28_4_ = 0xff800000;
    }
    else {
      auVar241 = vsqrtps_avx(auVar17);
      auVar251._0_4_ = fVar150 + fVar150;
      auVar251._4_4_ = fVar151 + fVar151;
      auVar251._8_4_ = fVar153 + fVar153;
      auVar251._12_4_ = fVar171 + fVar171;
      auVar251._16_4_ = fVar172 + fVar172;
      auVar251._20_4_ = fVar173 + fVar173;
      auVar251._24_4_ = fVar174 + fVar174;
      auVar251._28_4_ = (float)local_ae0._28_4_ + (float)local_ae0._28_4_;
      auVar235 = vrcpps_avx(auVar251);
      auVar107 = vcmpps_avx(auVar17,auVar107,5);
      auVar108._8_4_ = 0x3f800000;
      auVar108._0_8_ = &DAT_3f8000003f800000;
      auVar108._12_4_ = 0x3f800000;
      auVar108._16_4_ = 0x3f800000;
      auVar108._20_4_ = 0x3f800000;
      auVar108._24_4_ = 0x3f800000;
      auVar108._28_4_ = 0x3f800000;
      auVar101 = vfnmadd213ps_fma(auVar251,auVar235,auVar108);
      auVar101 = vfmadd132ps_fma(ZEXT1632(auVar101),auVar235,auVar235);
      auVar109._0_8_ = CONCAT44(fVar262,fVar257) ^ 0x8000000080000000;
      auVar109._8_4_ = -auVar259._8_4_;
      auVar109._12_4_ = -auVar259._12_4_;
      auVar109._16_4_ = -auVar259._16_4_;
      auVar109._20_4_ = -auVar259._20_4_;
      auVar109._24_4_ = -auVar259._24_4_;
      auVar109._28_4_ = -auVar259._28_4_;
      auVar17 = vsubps_avx(auVar109,auVar241);
      auVar49._4_4_ = auVar101._4_4_ * auVar17._4_4_;
      auVar49._0_4_ = auVar101._0_4_ * auVar17._0_4_;
      auVar49._8_4_ = auVar101._8_4_ * auVar17._8_4_;
      auVar49._12_4_ = auVar101._12_4_ * auVar17._12_4_;
      auVar49._16_4_ = auVar17._16_4_ * 0.0;
      auVar49._20_4_ = auVar17._20_4_ * 0.0;
      auVar49._24_4_ = auVar17._24_4_ * 0.0;
      auVar49._28_4_ = auVar17._28_4_;
      auVar17 = vsubps_avx(auVar241,auVar259);
      auVar50._4_4_ = auVar101._4_4_ * auVar17._4_4_;
      auVar50._0_4_ = auVar101._0_4_ * auVar17._0_4_;
      auVar50._8_4_ = auVar101._8_4_ * auVar17._8_4_;
      auVar50._12_4_ = auVar101._12_4_ * auVar17._12_4_;
      auVar50._16_4_ = auVar17._16_4_ * 0.0;
      auVar50._20_4_ = auVar17._20_4_ * 0.0;
      auVar50._24_4_ = auVar17._24_4_ * 0.0;
      auVar50._28_4_ = auVar235._28_4_;
      auVar101 = vfmadd213ps_fma(auVar230,auVar49,auVar233);
      local_420 = ZEXT1632(CONCAT412(fVar154 * auVar101._12_4_,
                                     CONCAT48(fVar152 * auVar101._8_4_,
                                              CONCAT44(fVar155 * auVar101._4_4_,
                                                       fVar121 * auVar101._0_4_))));
      auVar101 = vfmadd213ps_fma(auVar230,auVar50,auVar233);
      local_440 = ZEXT1632(CONCAT412(fVar154 * auVar101._12_4_,
                                     CONCAT48(fVar152 * auVar101._8_4_,
                                              CONCAT44(fVar155 * auVar101._4_4_,
                                                       fVar121 * auVar101._0_4_))));
      auVar164._8_4_ = 0x7f800000;
      auVar164._0_8_ = 0x7f8000007f800000;
      auVar164._12_4_ = 0x7f800000;
      auVar164._16_4_ = 0x7f800000;
      auVar164._20_4_ = 0x7f800000;
      auVar164._24_4_ = 0x7f800000;
      auVar164._28_4_ = 0x7f800000;
      auVar250 = vblendvps_avx(auVar164,auVar49,auVar107);
      auVar17 = vandps_avx(auVar47,local_720);
      auVar17 = vmaxps_avx(local_380,auVar17);
      auVar51._4_4_ = auVar17._4_4_ * 1.9073486e-06;
      auVar51._0_4_ = auVar17._0_4_ * 1.9073486e-06;
      auVar51._8_4_ = auVar17._8_4_ * 1.9073486e-06;
      auVar51._12_4_ = auVar17._12_4_ * 1.9073486e-06;
      auVar51._16_4_ = auVar17._16_4_ * 1.9073486e-06;
      auVar51._20_4_ = auVar17._20_4_ * 1.9073486e-06;
      auVar51._24_4_ = auVar17._24_4_ * 1.9073486e-06;
      auVar51._28_4_ = auVar17._28_4_;
      auVar17 = vandps_avx(local_720,local_ae0);
      auVar17 = vcmpps_avx(auVar17,auVar51,1);
      auVar110._8_4_ = 0xff800000;
      auVar110._0_8_ = 0xff800000ff800000;
      auVar110._12_4_ = 0xff800000;
      auVar110._16_4_ = 0xff800000;
      auVar110._20_4_ = 0xff800000;
      auVar110._24_4_ = 0xff800000;
      auVar110._28_4_ = 0xff800000;
      auVar260 = vblendvps_avx(auVar110,auVar50,auVar107);
      auVar235 = auVar107 & auVar17;
      if ((((((((auVar235 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar235 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar235 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar235 >> 0x7f,0) != '\0') ||
            (auVar235 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar235 >> 0xbf,0) != '\0') ||
          (auVar235 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar235[0x1f] < '\0') {
        auVar113 = vandps_avx(auVar17,auVar107);
        auVar19 = vcmpps_avx(auVar19,_DAT_02020f00,2);
        auVar232._8_4_ = 0xff800000;
        auVar232._0_8_ = 0xff800000ff800000;
        auVar232._12_4_ = 0xff800000;
        auVar232._16_4_ = 0xff800000;
        auVar232._20_4_ = 0xff800000;
        auVar232._24_4_ = 0xff800000;
        auVar232._28_4_ = 0xff800000;
        auVar280._8_4_ = 0x7f800000;
        auVar280._0_8_ = 0x7f8000007f800000;
        auVar280._12_4_ = 0x7f800000;
        auVar280._16_4_ = 0x7f800000;
        auVar280._20_4_ = 0x7f800000;
        auVar280._24_4_ = 0x7f800000;
        auVar280._28_4_ = 0x7f800000;
        auVar17 = vblendvps_avx(auVar280,auVar232,auVar19);
        auVar101 = vpackssdw_avx(auVar113._0_16_,auVar113._16_16_);
        auVar235 = vpmovsxwd_avx2(auVar101);
        auVar250 = vblendvps_avx(auVar250,auVar17,auVar235);
        auVar17 = vblendvps_avx(auVar232,auVar280,auVar19);
        auVar260 = vblendvps_avx(auVar260,auVar17,auVar235);
        auVar116._0_8_ = auVar113._0_8_ ^ 0xffffffffffffffff;
        auVar116._8_4_ = auVar113._8_4_ ^ 0xffffffff;
        auVar116._12_4_ = auVar113._12_4_ ^ 0xffffffff;
        auVar116._16_4_ = auVar113._16_4_ ^ 0xffffffff;
        auVar116._20_4_ = auVar113._20_4_ ^ 0xffffffff;
        auVar116._24_4_ = auVar113._24_4_ ^ 0xffffffff;
        auVar116._28_4_ = auVar113._28_4_ ^ 0xffffffff;
        auVar113 = vorps_avx(auVar19,auVar116);
        auVar113 = vandps_avx(auVar107,auVar113);
      }
    }
    auVar17 = local_280 & auVar113;
    if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar17 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar17 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar17 >> 0x7f,0) == '\0') &&
          (auVar17 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar17 >> 0xbf,0) == '\0') &&
        (auVar17 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar17[0x1f]) {
LAB_01924186:
      auVar253 = ZEXT3264(local_980);
      auVar243 = ZEXT3264(local_860);
    }
    else {
      fVar244 = (ray->org).field_0.m128[3] - (float)local_750._0_4_;
      auVar111._4_4_ = fVar244;
      auVar111._0_4_ = fVar244;
      auVar111._8_4_ = fVar244;
      auVar111._12_4_ = fVar244;
      auVar111._16_4_ = fVar244;
      auVar111._20_4_ = fVar244;
      auVar111._24_4_ = fVar244;
      auVar111._28_4_ = fVar244;
      auVar19 = vmaxps_avx(auVar111,auVar250);
      fVar244 = ray->tfar - (float)local_750._0_4_;
      auVar220._4_4_ = fVar244;
      auVar220._0_4_ = fVar244;
      auVar220._8_4_ = fVar244;
      auVar220._12_4_ = fVar244;
      auVar220._16_4_ = fVar244;
      auVar220._20_4_ = fVar244;
      auVar220._24_4_ = fVar244;
      auVar220._28_4_ = fVar244;
      auVar52._4_4_ = fVar207 * local_5e0._4_4_;
      auVar52._0_4_ = fVar196 * local_5e0._0_4_;
      auVar52._8_4_ = fVar208 * local_5e0._8_4_;
      auVar52._12_4_ = fVar209 * local_5e0._12_4_;
      auVar52._16_4_ = fVar210 * local_5e0._16_4_;
      auVar52._20_4_ = fVar211 * local_5e0._20_4_;
      auVar52._24_4_ = fVar212 * local_5e0._24_4_;
      auVar52._28_4_ = auVar18._28_4_;
      auVar101 = vfmadd213ps_fma(auVar106,local_9c0,auVar52);
      auVar201 = vfmadd213ps_fma(auVar227,_local_7c0,ZEXT1632(auVar101));
      auVar53._4_4_ = fStack_47c * local_5e0._4_4_;
      auVar53._0_4_ = local_480 * local_5e0._0_4_;
      auVar53._8_4_ = fStack_478 * local_5e0._8_4_;
      auVar53._12_4_ = fStack_474 * local_5e0._12_4_;
      auVar53._16_4_ = fStack_470 * local_5e0._16_4_;
      auVar53._20_4_ = fStack_46c * local_5e0._20_4_;
      auVar53._24_4_ = fStack_468 * local_5e0._24_4_;
      auVar53._28_4_ = 0;
      auVar101 = vfmadd231ps_fma(auVar53,_local_6c0,local_9c0);
      auVar238 = vfmadd231ps_fma(ZEXT1632(auVar101),_local_6a0,_local_7c0);
      auVar17 = vandps_avx(ZEXT1632(auVar238),local_720);
      auVar271._8_4_ = 0x219392ef;
      auVar271._0_8_ = 0x219392ef219392ef;
      auVar271._12_4_ = 0x219392ef;
      auVar271._16_4_ = 0x219392ef;
      auVar271._20_4_ = 0x219392ef;
      auVar271._24_4_ = 0x219392ef;
      auVar271._28_4_ = 0x219392ef;
      auVar18 = vcmpps_avx(auVar17,auVar271,1);
      auVar17 = vrcpps_avx(ZEXT1632(auVar238));
      auVar265._8_4_ = 0x3f800000;
      auVar265._0_8_ = &DAT_3f8000003f800000;
      auVar265._12_4_ = 0x3f800000;
      auVar265._16_4_ = 0x3f800000;
      auVar265._20_4_ = 0x3f800000;
      auVar265._24_4_ = 0x3f800000;
      auVar265._28_4_ = 0x3f800000;
      auVar268 = ZEXT3264(auVar265);
      auVar227 = ZEXT1632(auVar238);
      auVar101 = vfnmadd213ps_fma(auVar17,auVar227,auVar265);
      auVar101 = vfmadd132ps_fma(ZEXT1632(auVar101),auVar17,auVar17);
      auVar191._0_8_ = auVar238._0_8_ ^ 0x8000000080000000;
      auVar191._8_4_ = auVar238._8_4_ ^ 0x80000000;
      auVar191._12_4_ = auVar238._12_4_ ^ 0x80000000;
      auVar191._16_4_ = 0x80000000;
      auVar191._20_4_ = 0x80000000;
      auVar191._24_4_ = 0x80000000;
      auVar191._28_4_ = 0x80000000;
      auVar252._0_4_ = auVar101._0_4_ * -auVar201._0_4_;
      auVar252._4_4_ = auVar101._4_4_ * -auVar201._4_4_;
      auVar252._8_4_ = auVar101._8_4_ * -auVar201._8_4_;
      auVar252._12_4_ = auVar101._12_4_ * -auVar201._12_4_;
      auVar252._16_4_ = 0x80000000;
      auVar252._20_4_ = 0x80000000;
      auVar252._24_4_ = 0x80000000;
      auVar252._28_4_ = 0;
      auVar17 = vcmpps_avx(auVar227,auVar191,1);
      auVar17 = vorps_avx(auVar18,auVar17);
      auVar278._8_4_ = 0xff800000;
      auVar278._0_8_ = 0xff800000ff800000;
      auVar278._12_4_ = 0xff800000;
      auVar278._16_4_ = 0xff800000;
      auVar278._20_4_ = 0xff800000;
      auVar278._24_4_ = 0xff800000;
      auVar278._28_4_ = 0xff800000;
      auVar17 = vblendvps_avx(auVar252,auVar278,auVar17);
      auVar106 = vminps_avx(auVar220,auVar260);
      auVar19 = vmaxps_avx(auVar19,auVar17);
      auVar17 = vcmpps_avx(auVar227,auVar191,6);
      auVar17 = vorps_avx(auVar18,auVar17);
      auVar279._8_4_ = 0x7f800000;
      auVar279._0_8_ = 0x7f8000007f800000;
      auVar279._12_4_ = 0x7f800000;
      auVar279._16_4_ = 0x7f800000;
      auVar279._20_4_ = 0x7f800000;
      auVar279._24_4_ = 0x7f800000;
      auVar279._28_4_ = 0x7f800000;
      auVar17 = vblendvps_avx(auVar252,auVar279,auVar17);
      auVar106 = vminps_avx(auVar106,auVar17);
      auVar17 = vsubps_avx(ZEXT832(0) << 0x40,local_780);
      auVar18 = vsubps_avx(ZEXT832(0) << 0x40,local_7a0);
      auVar54._4_4_ = auVar18._4_4_ * fVar281;
      auVar54._0_4_ = auVar18._0_4_ * fVar92;
      auVar54._8_4_ = auVar18._8_4_ * fVar282;
      auVar54._12_4_ = auVar18._12_4_ * fVar283;
      auVar54._16_4_ = auVar18._16_4_ * fVar14;
      auVar54._20_4_ = auVar18._20_4_ * fVar15;
      auVar54._24_4_ = auVar18._24_4_ * fVar16;
      auVar54._28_4_ = auVar18._28_4_;
      auVar101 = vfnmsub231ps_fma(auVar54,local_920,auVar17);
      auVar17 = vsubps_avx(ZEXT832(0) << 0x40,auVar21);
      auVar201 = vfnmadd231ps_fma(ZEXT1632(auVar101),local_a80,auVar17);
      auVar55._4_4_ = fStack_47c * fVar281;
      auVar55._0_4_ = local_480 * fVar92;
      auVar55._8_4_ = fStack_478 * fVar282;
      auVar55._12_4_ = fStack_474 * fVar283;
      auVar55._16_4_ = fStack_470 * fVar14;
      auVar55._20_4_ = fStack_46c * fVar15;
      auVar55._24_4_ = fStack_468 * fVar16;
      auVar55._28_4_ = auVar17._28_4_;
      auVar101 = vfnmsub231ps_fma(auVar55,local_920,_local_6c0);
      auVar238 = vfnmadd231ps_fma(ZEXT1632(auVar101),_local_6a0,local_a80);
      auVar17 = vandps_avx(ZEXT1632(auVar238),local_720);
      auVar227 = vrcpps_avx(ZEXT1632(auVar238));
      auVar203._8_4_ = 0x219392ef;
      auVar203._0_8_ = 0x219392ef219392ef;
      auVar203._12_4_ = 0x219392ef;
      auVar203._16_4_ = 0x219392ef;
      auVar203._20_4_ = 0x219392ef;
      auVar203._24_4_ = 0x219392ef;
      auVar203._28_4_ = 0x219392ef;
      auVar18 = vcmpps_avx(auVar17,auVar203,1);
      auVar107 = ZEXT1632(auVar238);
      auVar101 = vfnmadd213ps_fma(auVar227,auVar107,auVar265);
      auVar101 = vfmadd132ps_fma(ZEXT1632(auVar101),auVar227,auVar227);
      auVar231._0_8_ = auVar238._0_8_ ^ 0x8000000080000000;
      auVar231._8_4_ = auVar238._8_4_ ^ 0x80000000;
      auVar231._12_4_ = auVar238._12_4_ ^ 0x80000000;
      auVar231._16_4_ = 0x80000000;
      auVar231._20_4_ = 0x80000000;
      auVar231._24_4_ = 0x80000000;
      auVar231._28_4_ = 0x80000000;
      auVar56._4_4_ = auVar101._4_4_ * -auVar201._4_4_;
      auVar56._0_4_ = auVar101._0_4_ * -auVar201._0_4_;
      auVar56._8_4_ = auVar101._8_4_ * -auVar201._8_4_;
      auVar56._12_4_ = auVar101._12_4_ * -auVar201._12_4_;
      auVar56._16_4_ = 0x80000000;
      auVar56._20_4_ = 0x80000000;
      auVar56._24_4_ = 0x80000000;
      auVar56._28_4_ = 0x80000000;
      auVar17 = vcmpps_avx(auVar107,auVar231,1);
      auVar17 = vorps_avx(auVar17,auVar18);
      auVar204._8_4_ = 0xff800000;
      auVar204._0_8_ = 0xff800000ff800000;
      auVar204._12_4_ = 0xff800000;
      auVar204._16_4_ = 0xff800000;
      auVar204._20_4_ = 0xff800000;
      auVar204._24_4_ = 0xff800000;
      auVar204._28_4_ = 0xff800000;
      auVar17 = vblendvps_avx(auVar56,auVar204,auVar17);
      _local_700 = vmaxps_avx(auVar19,auVar17);
      auVar17 = vcmpps_avx(auVar107,auVar231,6);
      auVar17 = vorps_avx(auVar18,auVar17);
      auVar17 = vblendvps_avx(auVar56,auVar279,auVar17);
      auVar113 = vandps_avx(local_280,auVar113);
      local_3e0 = vminps_avx(auVar106,auVar17);
      auVar17 = vcmpps_avx(_local_700,local_3e0,2);
      auVar18 = auVar113 & auVar17;
      if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar18 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar18 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar18 >> 0x7f,0) == '\0') &&
            (auVar18 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar18 >> 0xbf,0) == '\0') &&
          (auVar18 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar18[0x1f])
      goto LAB_01924186;
      auVar18 = vminps_avx(local_420,auVar265);
      auVar18 = vmaxps_avx(auVar18,ZEXT832(0) << 0x20);
      auVar19 = vminps_avx(local_440,auVar265);
      auVar19 = vmaxps_avx(auVar19,ZEXT832(0) << 0x20);
      auVar58._4_4_ = (auVar18._4_4_ + 1.0) * 0.125;
      auVar58._0_4_ = (auVar18._0_4_ + 0.0) * 0.125;
      auVar58._8_4_ = (auVar18._8_4_ + 2.0) * 0.125;
      auVar58._12_4_ = (auVar18._12_4_ + 3.0) * 0.125;
      auVar58._16_4_ = (auVar18._16_4_ + 4.0) * 0.125;
      auVar58._20_4_ = (auVar18._20_4_ + 5.0) * 0.125;
      auVar58._24_4_ = (auVar18._24_4_ + 6.0) * 0.125;
      auVar58._28_4_ = auVar18._28_4_ + 7.0;
      auVar101 = vfmadd213ps_fma(auVar58,local_880,local_7e0);
      auVar59._4_4_ = (auVar19._4_4_ + 1.0) * 0.125;
      auVar59._0_4_ = (auVar19._0_4_ + 0.0) * 0.125;
      auVar59._8_4_ = (auVar19._8_4_ + 2.0) * 0.125;
      auVar59._12_4_ = (auVar19._12_4_ + 3.0) * 0.125;
      auVar59._16_4_ = (auVar19._16_4_ + 4.0) * 0.125;
      auVar59._20_4_ = (auVar19._20_4_ + 5.0) * 0.125;
      auVar59._24_4_ = (auVar19._24_4_ + 6.0) * 0.125;
      auVar59._28_4_ = auVar19._28_4_ + 7.0;
      auVar201 = vfmadd213ps_fma(auVar59,local_880,local_7e0);
      auVar18 = vminps_avx(auVar163,_local_8c0);
      auVar19 = vminps_avx(local_600,local_820);
      auVar18 = vminps_avx(auVar18,auVar19);
      auVar18 = vsubps_avx(auVar18,_local_660);
      auVar113 = vandps_avx(auVar17,auVar113);
      local_420 = ZEXT1632(auVar101);
      local_440 = ZEXT1632(auVar201);
      auVar60._4_4_ = auVar18._4_4_ * 0.99999976;
      auVar60._0_4_ = auVar18._0_4_ * 0.99999976;
      auVar60._8_4_ = auVar18._8_4_ * 0.99999976;
      auVar60._12_4_ = auVar18._12_4_ * 0.99999976;
      auVar60._16_4_ = auVar18._16_4_ * 0.99999976;
      auVar60._20_4_ = auVar18._20_4_ * 0.99999976;
      auVar60._24_4_ = auVar18._24_4_ * 0.99999976;
      auVar60._28_4_ = 0x3f7ffffc;
      auVar17 = vmaxps_avx(ZEXT832(0) << 0x40,auVar60);
      auVar61._4_4_ = auVar17._4_4_ * auVar17._4_4_;
      auVar61._0_4_ = auVar17._0_4_ * auVar17._0_4_;
      auVar61._8_4_ = auVar17._8_4_ * auVar17._8_4_;
      auVar61._12_4_ = auVar17._12_4_ * auVar17._12_4_;
      auVar61._16_4_ = auVar17._16_4_ * auVar17._16_4_;
      auVar61._20_4_ = auVar17._20_4_ * auVar17._20_4_;
      auVar61._24_4_ = auVar17._24_4_ * auVar17._24_4_;
      auVar61._28_4_ = auVar17._28_4_;
      auVar18 = vsubps_avx(local_620,auVar61);
      auVar62._4_4_ = auVar18._4_4_ * (float)local_680._4_4_;
      auVar62._0_4_ = auVar18._0_4_ * (float)local_680._0_4_;
      auVar62._8_4_ = auVar18._8_4_ * fStack_678;
      auVar62._12_4_ = auVar18._12_4_ * fStack_674;
      auVar62._16_4_ = auVar18._16_4_ * fStack_670;
      auVar62._20_4_ = auVar18._20_4_ * fStack_66c;
      auVar62._24_4_ = auVar18._24_4_ * fStack_668;
      auVar62._28_4_ = auVar17._28_4_;
      auVar19 = vsubps_avx(local_640,auVar62);
      local_8e0 = vcmpps_avx(auVar19,ZEXT832(0) << 0x20,5);
      auVar17 = local_8e0;
      if ((((((((local_8e0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (local_8e0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (local_8e0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(local_8e0 >> 0x7f,0) == '\0') &&
            (local_8e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(local_8e0 >> 0xbf,0) == '\0') &&
          (local_8e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < local_8e0[0x1f]) {
        auVar73 = ZEXT412(0);
        auVar167 = ZEXT1232(auVar73) << 0x20;
        local_5a0 = ZEXT1232(auVar73) << 0x20;
        _local_5c0 = ZEXT1232(auVar73) << 0x20;
        auVar194 = ZEXT1232(ZEXT812(0)) << 0x20;
        _local_b00 = ZEXT832(0) << 0x20;
        auVar221._8_4_ = 0x7f800000;
        auVar221._0_8_ = 0x7f8000007f800000;
        auVar221._12_4_ = 0x7f800000;
        auVar221._16_4_ = 0x7f800000;
        auVar221._20_4_ = 0x7f800000;
        auVar221._24_4_ = 0x7f800000;
        auVar221._28_4_ = 0x7f800000;
        auVar228._8_4_ = 0xff800000;
        auVar228._0_8_ = 0xff800000ff800000;
        auVar228._12_4_ = 0xff800000;
        auVar228._16_4_ = 0xff800000;
        auVar228._20_4_ = 0xff800000;
        auVar228._24_4_ = 0xff800000;
        auVar228._28_4_ = 0xff800000;
        local_8e0 = auVar21;
        local_580 = local_5a0;
      }
      else {
        auVar166._0_4_ = fVar150 + fVar150;
        auVar166._4_4_ = fVar151 + fVar151;
        auVar166._8_4_ = fVar153 + fVar153;
        auVar166._12_4_ = fVar171 + fVar171;
        auVar166._16_4_ = fVar172 + fVar172;
        auVar166._20_4_ = fVar173 + fVar173;
        auVar166._24_4_ = fVar174 + fVar174;
        auVar166._28_4_ = (float)local_ae0._28_4_ + (float)local_ae0._28_4_;
        auVar106 = vrcpps_avx(auVar166);
        auVar101 = vfnmadd213ps_fma(auVar166,auVar106,auVar265);
        auVar101 = vfmadd132ps_fma(ZEXT1632(auVar101),auVar106,auVar106);
        auVar106 = vsqrtps_avx(auVar19);
        auVar205._0_8_ = auVar259._0_8_ ^ 0x8000000080000000;
        auVar205._8_4_ = -auVar259._8_4_;
        auVar205._12_4_ = -auVar259._12_4_;
        auVar205._16_4_ = -auVar259._16_4_;
        auVar205._20_4_ = -auVar259._20_4_;
        auVar205._24_4_ = -auVar259._24_4_;
        auVar205._28_4_ = -auVar259._28_4_;
        auVar227 = vsubps_avx(auVar205,auVar106);
        auVar106 = vsubps_avx(auVar106,auVar259);
        fVar92 = auVar227._0_4_ * auVar101._0_4_;
        fVar150 = auVar227._4_4_ * auVar101._4_4_;
        auVar63._4_4_ = fVar150;
        auVar63._0_4_ = fVar92;
        fVar281 = auVar227._8_4_ * auVar101._8_4_;
        auVar63._8_4_ = fVar281;
        fVar151 = auVar227._12_4_ * auVar101._12_4_;
        auVar63._12_4_ = fVar151;
        fVar282 = auVar227._16_4_ * 0.0;
        auVar63._16_4_ = fVar282;
        fVar153 = auVar227._20_4_ * 0.0;
        auVar63._20_4_ = fVar153;
        fVar283 = auVar227._24_4_ * 0.0;
        auVar63._24_4_ = fVar283;
        auVar63._28_4_ = 0x7f800000;
        auVar272._0_4_ = auVar106._0_4_ * auVar101._0_4_;
        auVar272._4_4_ = auVar106._4_4_ * auVar101._4_4_;
        auVar272._8_4_ = auVar106._8_4_ * auVar101._8_4_;
        auVar272._12_4_ = auVar106._12_4_ * auVar101._12_4_;
        auVar272._16_4_ = auVar106._16_4_ * 0.0;
        auVar272._20_4_ = auVar106._20_4_ * 0.0;
        auVar272._24_4_ = auVar106._24_4_ * 0.0;
        auVar272._28_4_ = 0;
        auVar101 = vfmadd213ps_fma(auVar230,auVar63,auVar233);
        auVar201 = vfmadd213ps_fma(auVar230,auVar272,auVar233);
        auVar64._28_4_ = auVar227._28_4_;
        auVar64._0_28_ =
             ZEXT1628(CONCAT412(fVar154 * auVar101._12_4_,
                                CONCAT48(fVar152 * auVar101._8_4_,
                                         CONCAT44(fVar155 * auVar101._4_4_,fVar121 * auVar101._0_4_)
                                        )));
        auVar106 = ZEXT1632(CONCAT412(fVar154 * auVar201._12_4_,
                                      CONCAT48(fVar152 * auVar201._8_4_,
                                               CONCAT44(fVar155 * auVar201._4_4_,
                                                        fVar121 * auVar201._0_4_))));
        auVar101 = vfmadd213ps_fma(auVar20,auVar64,local_ac0);
        auVar201 = vfmadd213ps_fma(auVar20,auVar106,local_ac0);
        auVar238 = vfmadd213ps_fma(auVar194,auVar64,auVar104);
        auVar137 = vfmadd213ps_fma(auVar194,auVar106,auVar104);
        auVar4 = vfmadd213ps_fma(auVar64,auVar167,auVar234);
        auVar159 = vfmadd213ps_fma(auVar167,auVar106,auVar234);
        auVar65._4_4_ = fVar150 * (float)local_6a0._4_4_;
        auVar65._0_4_ = fVar92 * (float)local_6a0._0_4_;
        auVar65._8_4_ = fVar281 * fStack_698;
        auVar65._12_4_ = fVar151 * fStack_694;
        auVar65._16_4_ = fVar282 * fStack_690;
        auVar65._20_4_ = fVar153 * fStack_68c;
        auVar65._24_4_ = fVar283 * fStack_688;
        auVar65._28_4_ = 0;
        auVar167 = vsubps_avx(auVar65,ZEXT1632(auVar101));
        auVar193._0_4_ = fVar92 * (float)local_6c0._0_4_;
        auVar193._4_4_ = fVar150 * (float)local_6c0._4_4_;
        auVar193._8_4_ = fVar281 * fStack_6b8;
        auVar193._12_4_ = fVar151 * fStack_6b4;
        auVar193._16_4_ = fVar282 * fStack_6b0;
        auVar193._20_4_ = fVar153 * fStack_6ac;
        auVar193._24_4_ = fVar283 * fStack_6a8;
        auVar193._28_4_ = 0;
        auVar194 = vsubps_avx(auVar193,ZEXT1632(auVar238));
        auVar222._0_4_ = local_480 * fVar92;
        auVar222._4_4_ = fStack_47c * fVar150;
        auVar222._8_4_ = fStack_478 * fVar281;
        auVar222._12_4_ = fStack_474 * fVar151;
        auVar222._16_4_ = fStack_470 * fVar282;
        auVar222._20_4_ = fStack_46c * fVar153;
        auVar222._24_4_ = fStack_468 * fVar283;
        auVar222._28_4_ = 0;
        _local_b00 = vsubps_avx(auVar222,ZEXT1632(auVar4));
        auVar66._4_4_ = auVar272._4_4_ * (float)local_6a0._4_4_;
        auVar66._0_4_ = auVar272._0_4_ * (float)local_6a0._0_4_;
        auVar66._8_4_ = auVar272._8_4_ * fStack_698;
        auVar66._12_4_ = auVar272._12_4_ * fStack_694;
        auVar66._16_4_ = auVar272._16_4_ * fStack_690;
        auVar66._20_4_ = auVar272._20_4_ * fStack_68c;
        auVar66._24_4_ = auVar272._24_4_ * fStack_688;
        auVar66._28_4_ = 0;
        local_580 = vsubps_avx(auVar66,ZEXT1632(auVar201));
        auVar67._4_4_ = auVar272._4_4_ * (float)local_6c0._4_4_;
        auVar67._0_4_ = auVar272._0_4_ * (float)local_6c0._0_4_;
        auVar67._8_4_ = auVar272._8_4_ * fStack_6b8;
        auVar67._12_4_ = auVar272._12_4_ * fStack_6b4;
        auVar67._16_4_ = auVar272._16_4_ * fStack_6b0;
        auVar67._20_4_ = auVar272._20_4_ * fStack_6ac;
        auVar67._24_4_ = auVar272._24_4_ * fStack_6a8;
        auVar67._28_4_ = local_580._28_4_;
        local_5a0 = vsubps_avx(auVar67,ZEXT1632(auVar137));
        auVar68._4_4_ = fStack_47c * auVar272._4_4_;
        auVar68._0_4_ = local_480 * auVar272._0_4_;
        auVar68._8_4_ = fStack_478 * auVar272._8_4_;
        auVar68._12_4_ = fStack_474 * auVar272._12_4_;
        auVar68._16_4_ = fStack_470 * auVar272._16_4_;
        auVar68._20_4_ = fStack_46c * auVar272._20_4_;
        auVar68._24_4_ = fStack_468 * auVar272._24_4_;
        auVar68._28_4_ = local_5a0._28_4_;
        _local_5c0 = vsubps_avx(auVar68,ZEXT1632(auVar159));
        auVar20 = vcmpps_avx(auVar19,_DAT_02020f00,5);
        auVar223._8_4_ = 0x7f800000;
        auVar223._0_8_ = 0x7f8000007f800000;
        auVar223._12_4_ = 0x7f800000;
        auVar223._16_4_ = 0x7f800000;
        auVar223._20_4_ = 0x7f800000;
        auVar223._24_4_ = 0x7f800000;
        auVar223._28_4_ = 0x7f800000;
        auVar221 = vblendvps_avx(auVar223,auVar63,auVar20);
        auVar19 = vandps_avx(local_720,auVar47);
        auVar19 = vmaxps_avx(local_380,auVar19);
        auVar69._4_4_ = auVar19._4_4_ * 1.9073486e-06;
        auVar69._0_4_ = auVar19._0_4_ * 1.9073486e-06;
        auVar69._8_4_ = auVar19._8_4_ * 1.9073486e-06;
        auVar69._12_4_ = auVar19._12_4_ * 1.9073486e-06;
        auVar69._16_4_ = auVar19._16_4_ * 1.9073486e-06;
        auVar69._20_4_ = auVar19._20_4_ * 1.9073486e-06;
        auVar69._24_4_ = auVar19._24_4_ * 1.9073486e-06;
        auVar69._28_4_ = auVar19._28_4_;
        auVar19 = vandps_avx(local_720,local_ae0);
        auVar19 = vcmpps_avx(auVar19,auVar69,1);
        auVar229._8_4_ = 0xff800000;
        auVar229._0_8_ = 0xff800000ff800000;
        auVar229._12_4_ = 0xff800000;
        auVar229._16_4_ = 0xff800000;
        auVar229._20_4_ = 0xff800000;
        auVar229._24_4_ = 0xff800000;
        auVar229._28_4_ = 0xff800000;
        auVar228 = vblendvps_avx(auVar229,auVar272,auVar20);
        auVar106 = auVar20 & auVar19;
        if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar106 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar106 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar106 >> 0x7f,0) != '\0') ||
              (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar106 >> 0xbf,0) != '\0') ||
            (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar106[0x1f] < '\0') {
          auVar17 = vandps_avx(auVar19,auVar20);
          auVar19 = vcmpps_avx(auVar18,ZEXT832(0) << 0x20,2);
          auVar261._8_4_ = 0xff800000;
          auVar261._0_8_ = 0xff800000ff800000;
          auVar261._12_4_ = 0xff800000;
          auVar261._16_4_ = 0xff800000;
          auVar261._20_4_ = 0xff800000;
          auVar261._24_4_ = 0xff800000;
          auVar261._28_4_ = 0xff800000;
          auVar267._8_4_ = 0x7f800000;
          auVar267._0_8_ = 0x7f8000007f800000;
          auVar267._12_4_ = 0x7f800000;
          auVar267._16_4_ = 0x7f800000;
          auVar267._20_4_ = 0x7f800000;
          auVar267._24_4_ = 0x7f800000;
          auVar267._28_4_ = 0x7f800000;
          auVar18 = vblendvps_avx(auVar267,auVar261,auVar19);
          auVar101 = vpackssdw_avx(auVar17._0_16_,auVar17._16_16_);
          auVar106 = vpmovsxwd_avx2(auVar101);
          auVar221 = vblendvps_avx(auVar221,auVar18,auVar106);
          auVar18 = vblendvps_avx(auVar261,auVar267,auVar19);
          auVar228 = vblendvps_avx(auVar228,auVar18,auVar106);
          auVar237._0_8_ = auVar17._0_8_ ^ 0xffffffffffffffff;
          auVar237._8_4_ = auVar17._8_4_ ^ 0xffffffff;
          auVar237._12_4_ = auVar17._12_4_ ^ 0xffffffff;
          auVar237._16_4_ = auVar17._16_4_ ^ 0xffffffff;
          auVar237._20_4_ = auVar17._20_4_ ^ 0xffffffff;
          auVar237._24_4_ = auVar17._24_4_ ^ 0xffffffff;
          auVar237._28_4_ = auVar17._28_4_ ^ 0xffffffff;
          auVar17 = vorps_avx(auVar19,auVar237);
          auVar17 = vandps_avx(auVar17,auVar20);
        }
      }
      uVar90 = *(undefined4 *)&(ray->dir).field_0;
      auVar266._4_4_ = uVar90;
      auVar266._0_4_ = uVar90;
      auVar266._8_4_ = uVar90;
      auVar266._12_4_ = uVar90;
      auVar266._16_4_ = uVar90;
      auVar266._20_4_ = uVar90;
      auVar266._24_4_ = uVar90;
      auVar266._28_4_ = uVar90;
      auVar268 = ZEXT3264(auVar266);
      uVar90 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
      auVar273._4_4_ = uVar90;
      auVar273._0_4_ = uVar90;
      auVar273._8_4_ = uVar90;
      auVar273._12_4_ = uVar90;
      auVar273._16_4_ = uVar90;
      auVar273._20_4_ = uVar90;
      auVar273._24_4_ = uVar90;
      auVar273._28_4_ = uVar90;
      fVar92 = (ray->dir).field_0.m128[2];
      local_3c0 = _local_700;
      local_3a0 = vminps_avx(local_3e0,auVar221);
      _local_4e0 = vmaxps_avx(_local_700,auVar228);
      _local_400 = _local_4e0;
      auVar18 = vcmpps_avx(_local_700,local_3a0,2);
      local_4a0 = vandps_avx(auVar18,auVar113);
      auVar18 = vcmpps_avx(_local_4e0,local_3e0,2);
      local_540 = vandps_avx(auVar18,auVar113);
      auVar113 = vorps_avx(local_540,local_4a0);
      auVar253 = ZEXT3264(local_980);
      auVar243 = ZEXT3264(local_860);
      if ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar113 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar113 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar113 >> 0x7f,0) != '\0') ||
            (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar113 >> 0xbf,0) != '\0') ||
          (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar113[0x1f] < '\0') {
        local_300._0_8_ = auVar17._0_8_ ^ 0xffffffffffffffff;
        local_300._8_4_ = auVar17._8_4_ ^ 0xffffffff;
        local_300._12_4_ = auVar17._12_4_ ^ 0xffffffff;
        local_300._16_4_ = auVar17._16_4_ ^ 0xffffffff;
        local_300._20_4_ = auVar17._20_4_ ^ 0xffffffff;
        local_300._24_4_ = auVar17._24_4_ ^ 0xffffffff;
        local_300._28_4_ = auVar17._28_4_ ^ 0xffffffff;
        auVar70._4_4_ = fVar92 * (float)local_b00._4_4_;
        auVar70._0_4_ = fVar92 * (float)local_b00._0_4_;
        auVar70._8_4_ = fVar92 * fStack_af8;
        auVar70._12_4_ = fVar92 * fStack_af4;
        auVar70._16_4_ = fVar92 * fStack_af0;
        auVar70._20_4_ = fVar92 * fStack_aec;
        auVar70._24_4_ = fVar92 * fStack_ae8;
        auVar70._28_4_ = auVar113._28_4_;
        auVar101 = vfmadd213ps_fma(auVar194,auVar273,auVar70);
        auVar101 = vfmadd213ps_fma(auVar167,auVar266,ZEXT1632(auVar101));
        auVar113 = vandps_avx(ZEXT1632(auVar101),local_720);
        auVar142._8_4_ = 0x3e99999a;
        auVar142._0_8_ = 0x3e99999a3e99999a;
        auVar142._12_4_ = 0x3e99999a;
        auVar142._16_4_ = 0x3e99999a;
        auVar142._20_4_ = 0x3e99999a;
        auVar142._24_4_ = 0x3e99999a;
        auVar142._28_4_ = 0x3e99999a;
        auVar113 = vcmpps_avx(auVar113,auVar142,1);
        auVar113 = vorps_avx(auVar113,local_300);
        auVar143._8_4_ = 3;
        auVar143._0_8_ = 0x300000003;
        auVar143._12_4_ = 3;
        auVar143._16_4_ = 3;
        auVar143._20_4_ = 3;
        auVar143._24_4_ = 3;
        auVar143._28_4_ = 3;
        auVar168._8_4_ = 2;
        auVar168._0_8_ = 0x200000002;
        auVar168._12_4_ = 2;
        auVar168._16_4_ = 2;
        auVar168._20_4_ = 2;
        auVar168._24_4_ = 2;
        auVar168._28_4_ = 2;
        auVar113 = vblendvps_avx(auVar168,auVar143,auVar113);
        uVar90 = (undefined4)uVar91;
        local_320._4_4_ = uVar90;
        local_320._0_4_ = uVar90;
        local_320._8_4_ = uVar90;
        local_320._12_4_ = uVar90;
        local_320._16_4_ = uVar90;
        local_320._20_4_ = uVar90;
        local_320._24_4_ = uVar90;
        local_320._28_4_ = uVar90;
        local_4c0 = vpcmpgtd_avx2(auVar113,local_320);
        local_520 = vpandn_avx2(local_4c0,local_4a0);
        auVar243 = ZEXT3264(local_520);
        auVar113 = local_4a0 & ~local_4c0;
        local_560 = ZEXT1632(CONCAT88(auVar94._8_8_,uVar91));
        fVar121 = fVar92;
        fVar150 = fVar92;
        fVar281 = fVar92;
        fVar155 = fVar92;
        fVar151 = fVar92;
        fVar282 = fVar92;
        local_500 = local_540;
        if ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar113 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar113 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar113 >> 0x7f,0) != '\0') ||
              (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar113 >> 0xbf,0) != '\0') ||
            (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar113[0x1f] < '\0') {
          auVar201 = vminps_avx(local_a20,local_a40);
          auVar101 = vmaxps_avx(local_a20,local_a40);
          local_8c0._4_4_ = fVar92;
          local_8c0._0_4_ = fVar92;
          fStack_8b8 = fVar92;
          fStack_8b4 = fVar92;
          fStack_8b0 = fVar92;
          fStack_8ac = fVar92;
          fStack_8a8 = fVar92;
          fStack_8a4 = fVar92;
          auVar238 = vminps_avx(local_a30,_local_a50);
          auVar137 = vminps_avx(auVar201,auVar238);
          auVar201 = vmaxps_avx(local_a30,_local_a50);
          auVar238 = vmaxps_avx(auVar101,auVar201);
          auVar176._8_4_ = 0x7fffffff;
          auVar176._0_8_ = 0x7fffffff7fffffff;
          auVar176._12_4_ = 0x7fffffff;
          auVar101 = vandps_avx(auVar137,auVar176);
          local_600._0_16_ = auVar176;
          auVar201 = vandps_avx(auVar238,auVar176);
          auVar101 = vmaxps_avx(auVar101,auVar201);
          auVar201 = vmovshdup_avx(auVar101);
          auVar201 = vmaxss_avx(auVar201,auVar101);
          auVar101 = vshufpd_avx(auVar101,auVar101,1);
          auVar101 = vmaxss_avx(auVar101,auVar201);
          local_7a0._0_4_ = auVar101._0_4_ * 1.9073486e-06;
          auVar101 = vshufps_avx(auVar238,auVar238,0xff);
          _local_680 = auVar101;
          local_6e0._4_4_ = (float)local_700._4_4_ + (float)local_800._4_4_;
          local_6e0._0_4_ = (float)local_700._0_4_ + (float)local_800._0_4_;
          fStack_6d8 = fStack_6f8 + fStack_7f8;
          fStack_6d4 = fStack_6f4 + fStack_7f4;
          fStack_6d0 = fStack_6f0 + fStack_7f0;
          fStack_6cc = fStack_6ec + fStack_7ec;
          fStack_6c8 = fStack_6e8 + fStack_7e8;
          fStack_6c4 = fStack_6e4 + fStack_7e4;
          local_8a0 = auVar273;
          local_880 = auVar266;
          do {
            auVar144._8_4_ = 0x7f800000;
            auVar144._0_8_ = 0x7f8000007f800000;
            auVar144._12_4_ = 0x7f800000;
            auVar144._16_4_ = 0x7f800000;
            auVar144._20_4_ = 0x7f800000;
            auVar144._24_4_ = 0x7f800000;
            auVar144._28_4_ = 0x7f800000;
            auVar113 = auVar243._0_32_;
            auVar17 = vblendvps_avx(auVar144,_local_700,auVar113);
            auVar18 = vshufps_avx(auVar17,auVar17,0xb1);
            auVar18 = vminps_avx(auVar17,auVar18);
            auVar19 = vshufpd_avx(auVar18,auVar18,5);
            auVar18 = vminps_avx(auVar18,auVar19);
            auVar19 = vpermpd_avx2(auVar18,0x4e);
            auVar18 = vminps_avx(auVar18,auVar19);
            auVar17 = vcmpps_avx(auVar17,auVar18,0);
            auVar18 = auVar113 & auVar17;
            if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar18 >> 0x7f,0) != '\0') ||
                  (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar18 >> 0xbf,0) != '\0') ||
                (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar18[0x1f] < '\0') {
              auVar113 = vandps_avx(auVar17,auVar113);
            }
            uVar84 = vmovmskps_avx(auVar113);
            iVar22 = 0;
            for (; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x80000000) {
              iVar22 = iVar22 + 1;
            }
            uVar84 = iVar22 << 2;
            *(undefined4 *)(local_520 + uVar84) = 0;
            aVar2 = (ray->dir).field_0;
            local_780._0_16_ = (undefined1  [16])aVar2;
            auVar101 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
            _local_b00 = ZEXT416(*(uint *)(local_3c0 + uVar84));
            if (auVar101._0_4_ < 0.0) {
              local_ac0._0_16_ = ZEXT416((uint)*(float *)(local_420 + uVar84));
              fVar92 = sqrtf(auVar101._0_4_);
              fVar152 = (float)local_ac0._0_4_;
              uVar90 = local_ac0._4_4_;
              uVar224 = local_ac0._8_4_;
              uVar225 = local_ac0._12_4_;
            }
            else {
              auVar101 = vsqrtss_avx(auVar101,auVar101);
              fVar92 = auVar101._0_4_;
              fVar152 = *(float *)(local_420 + uVar84);
              uVar90 = 0;
              uVar224 = 0;
              uVar225 = 0;
            }
            local_7e0._0_4_ = fVar92 * 1.9073486e-06;
            lVar87 = 5;
            do {
              auVar113 = local_ac0;
              fVar92 = 1.0 - fVar152;
              local_ac0._4_4_ = uVar90;
              local_ac0._0_4_ = fVar152;
              local_ac0._8_4_ = uVar224;
              local_ac0._16_16_ = auVar113._16_16_;
              local_ac0._12_4_ = uVar225;
              auVar123._0_4_ = local_a40._0_4_ * fVar152;
              auVar123._4_4_ = local_a40._4_4_ * fVar152;
              auVar123._8_4_ = local_a40._8_4_ * fVar152;
              auVar123._12_4_ = local_a40._12_4_ * fVar152;
              auVar158._4_4_ = fVar92;
              auVar158._0_4_ = fVar92;
              auVar158._8_4_ = fVar92;
              auVar158._12_4_ = fVar92;
              auVar101 = vfmadd231ps_fma(auVar123,auVar158,local_a20);
              auVar177._0_4_ = local_a30._0_4_ * fVar152;
              auVar177._4_4_ = local_a30._4_4_ * fVar152;
              auVar177._8_4_ = local_a30._8_4_ * fVar152;
              auVar177._12_4_ = local_a30._12_4_ * fVar152;
              auVar201 = vfmadd231ps_fma(auVar177,auVar158,local_a40);
              auVar215._0_4_ = fVar152 * auVar201._0_4_;
              auVar215._4_4_ = fVar152 * auVar201._4_4_;
              auVar215._8_4_ = fVar152 * auVar201._8_4_;
              auVar215._12_4_ = fVar152 * auVar201._12_4_;
              local_9c0._0_16_ = vfmadd231ps_fma(auVar215,auVar158,auVar101);
              auVar124._0_4_ = fVar152 * (float)local_a50._0_4_;
              auVar124._4_4_ = fVar152 * (float)local_a50._4_4_;
              auVar124._8_4_ = fVar152 * fStack_a48;
              auVar124._12_4_ = fVar152 * fStack_a44;
              auVar101 = vfmadd231ps_fma(auVar124,auVar158,local_a30);
              auVar198._0_4_ = fVar152 * auVar101._0_4_;
              auVar198._4_4_ = fVar152 * auVar101._4_4_;
              auVar198._8_4_ = fVar152 * auVar101._8_4_;
              auVar198._12_4_ = fVar152 * auVar101._12_4_;
              auVar201 = vfmadd231ps_fma(auVar198,auVar158,auVar201);
              auVar125._4_4_ = local_b00._0_4_;
              auVar125._0_4_ = local_b00._0_4_;
              auVar125._8_4_ = local_b00._0_4_;
              auVar125._12_4_ = local_b00._0_4_;
              auVar101 = vfmadd213ps_fma(auVar125,local_780._0_16_,_DAT_01feba10);
              auVar97._0_4_ = fVar152 * auVar201._0_4_;
              auVar97._4_4_ = fVar152 * auVar201._4_4_;
              auVar97._8_4_ = fVar152 * auVar201._8_4_;
              auVar97._12_4_ = fVar152 * auVar201._12_4_;
              auVar238 = vfmadd231ps_fma(auVar97,local_9c0._0_16_,auVar158);
              local_5e0._0_16_ = auVar238;
              auVar101 = vsubps_avx(auVar101,auVar238);
              _local_7c0 = auVar101;
              auVar101 = vdpps_avx(auVar101,auVar101,0x7f);
              local_8e0._0_16_ = auVar101;
              if (auVar101._0_4_ < 0.0) {
                local_ae0._0_16_ = ZEXT416((uint)fVar92);
                local_a80._0_16_ = auVar201;
                auVar118._0_4_ = sqrtf(auVar101._0_4_);
                auVar118._4_60_ = extraout_var;
                auVar101 = auVar118._0_16_;
                auVar201 = local_a80._0_16_;
                auVar238 = local_ae0._0_16_;
              }
              else {
                auVar101 = vsqrtss_avx(auVar101,auVar101);
                auVar238 = ZEXT416((uint)fVar92);
              }
              auVar201 = vsubps_avx(auVar201,local_9c0._0_16_);
              local_9c0._0_4_ = auVar201._0_4_ * 3.0;
              local_9c0._4_4_ = auVar201._4_4_ * 3.0;
              local_9c0._8_4_ = auVar201._8_4_ * 3.0;
              local_9c0._12_4_ = auVar201._12_4_ * 3.0;
              auVar201 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar238,local_ac0._0_16_);
              auVar137 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_ac0._0_16_,auVar238);
              fVar92 = auVar238._0_4_ * 6.0;
              fVar121 = auVar201._0_4_ * 6.0;
              fVar150 = auVar137._0_4_ * 6.0;
              fVar281 = local_ac0._0_4_ * 6.0;
              auVar178._0_4_ = fVar281 * (float)local_a50._0_4_;
              auVar178._4_4_ = fVar281 * (float)local_a50._4_4_;
              auVar178._8_4_ = fVar281 * fStack_a48;
              auVar178._12_4_ = fVar281 * fStack_a44;
              auVar126._4_4_ = fVar150;
              auVar126._0_4_ = fVar150;
              auVar126._8_4_ = fVar150;
              auVar126._12_4_ = fVar150;
              auVar201 = vfmadd132ps_fma(auVar126,auVar178,local_a30);
              auVar179._4_4_ = fVar121;
              auVar179._0_4_ = fVar121;
              auVar179._8_4_ = fVar121;
              auVar179._12_4_ = fVar121;
              auVar201 = vfmadd132ps_fma(auVar179,auVar201,local_a40);
              auVar238 = vdpps_avx(local_9c0._0_16_,local_9c0._0_16_,0x7f);
              auVar127._4_4_ = fVar92;
              auVar127._0_4_ = fVar92;
              auVar127._8_4_ = fVar92;
              auVar127._12_4_ = fVar92;
              auVar4 = vfmadd132ps_fma(auVar127,auVar201,local_a20);
              auVar201 = vblendps_avx(auVar238,_DAT_01feba10,0xe);
              auVar137 = vrsqrtss_avx(auVar201,auVar201);
              fVar150 = auVar238._0_4_;
              fVar92 = auVar137._0_4_;
              auVar137 = vdpps_avx(local_9c0._0_16_,auVar4,0x7f);
              fVar92 = fVar92 * 1.5 + fVar150 * -0.5 * fVar92 * fVar92 * fVar92;
              auVar128._0_4_ = auVar4._0_4_ * fVar150;
              auVar128._4_4_ = auVar4._4_4_ * fVar150;
              auVar128._8_4_ = auVar4._8_4_ * fVar150;
              auVar128._12_4_ = auVar4._12_4_ * fVar150;
              fVar121 = auVar137._0_4_;
              auVar216._0_4_ = local_9c0._0_4_ * fVar121;
              auVar216._4_4_ = local_9c0._4_4_ * fVar121;
              auVar216._8_4_ = local_9c0._8_4_ * fVar121;
              auVar216._12_4_ = local_9c0._12_4_ * fVar121;
              auVar137 = vsubps_avx(auVar128,auVar216);
              auVar201 = vrcpss_avx(auVar201,auVar201);
              auVar4 = vfnmadd213ss_fma(auVar201,auVar238,ZEXT416(0x40000000));
              fVar121 = auVar201._0_4_ * auVar4._0_4_;
              auVar201 = vmaxss_avx(ZEXT416((uint)local_7a0._0_4_),
                                    ZEXT416((uint)((float)local_b00._0_4_ * (float)local_7e0._0_4_))
                                   );
              local_ae0._0_4_ = auVar201._0_4_;
              uVar91 = CONCAT44(local_9c0._4_4_,local_9c0._0_4_);
              auVar239._0_8_ = uVar91 ^ 0x8000000080000000;
              auVar239._8_4_ = -local_9c0._8_4_;
              auVar239._12_4_ = -local_9c0._12_4_;
              auVar180._0_4_ = fVar92 * auVar137._0_4_ * fVar121;
              auVar180._4_4_ = fVar92 * auVar137._4_4_ * fVar121;
              auVar180._8_4_ = fVar92 * auVar137._8_4_ * fVar121;
              auVar180._12_4_ = fVar92 * auVar137._12_4_ * fVar121;
              local_920._0_4_ = local_9c0._0_4_ * fVar92;
              local_920._4_4_ = local_9c0._4_4_ * fVar92;
              local_920._8_4_ = local_9c0._8_4_ * fVar92;
              local_920._12_4_ = local_9c0._12_4_ * fVar92;
              if (fVar150 < -fVar150) {
                local_a80._0_4_ = auVar101._0_4_;
                local_900._0_16_ = auVar239;
                local_820._0_16_ = auVar180;
                fVar92 = sqrtf(fVar150);
                auVar101 = ZEXT416((uint)local_a80._0_4_);
                auVar180 = local_820._0_16_;
                auVar239 = local_900._0_16_;
              }
              else {
                auVar201 = vsqrtss_avx(auVar238,auVar238);
                fVar92 = auVar201._0_4_;
              }
              local_a80._0_16_ = vdpps_avx(_local_7c0,local_920._0_16_,0x7f);
              auVar4 = vfmadd213ss_fma(ZEXT416((uint)local_7a0._0_4_),auVar101,
                                       ZEXT416((uint)local_ae0._0_4_));
              auVar201 = vdpps_avx(auVar239,local_920._0_16_,0x7f);
              auVar238 = vdpps_avx(_local_7c0,auVar180,0x7f);
              auVar137 = vdpps_avx(local_780._0_16_,local_920._0_16_,0x7f);
              auVar101 = vfmadd213ss_fma(ZEXT416((uint)(auVar101._0_4_ + 1.0)),
                                         ZEXT416((uint)((float)local_7a0._0_4_ / fVar92)),auVar4);
              local_900._0_4_ = auVar101._0_4_;
              auVar98._0_4_ = local_a80._0_4_ * local_a80._0_4_;
              auVar98._4_4_ = local_a80._4_4_ * local_a80._4_4_;
              auVar98._8_4_ = local_a80._8_4_ * local_a80._8_4_;
              auVar98._12_4_ = local_a80._12_4_ * local_a80._12_4_;
              auVar101 = vdpps_avx(_local_7c0,auVar239,0x7f);
              auVar159 = vsubps_avx(local_8e0._0_16_,auVar98);
              auVar4 = vrsqrtss_avx(auVar159,auVar159);
              fVar121 = auVar159._0_4_;
              fVar92 = auVar4._0_4_;
              fVar92 = fVar92 * 1.5 + fVar121 * -0.5 * fVar92 * fVar92 * fVar92;
              auVar4 = vdpps_avx(_local_7c0,local_780._0_16_,0x7f);
              local_920._0_16_ = ZEXT416((uint)(auVar201._0_4_ + auVar238._0_4_));
              auVar101 = vfnmadd231ss_fma(auVar101,local_a80._0_16_,local_920._0_16_);
              auVar201 = vfnmadd231ss_fma(auVar4,local_a80._0_16_,auVar137);
              if (fVar121 < 0.0) {
                local_820._0_16_ = auVar137;
                local_620._0_16_ = auVar101;
                local_640._0_4_ = fVar92;
                _local_660 = auVar201;
                fVar121 = sqrtf(fVar121);
                fVar92 = (float)local_640._0_4_;
                auVar201 = _local_660;
                auVar137 = local_820._0_16_;
                auVar101 = local_620._0_16_;
              }
              else {
                auVar238 = vsqrtss_avx(auVar159,auVar159);
                fVar121 = auVar238._0_4_;
              }
              auVar268 = ZEXT3264(local_9a0);
              auVar238 = vpermilps_avx(local_5e0._0_16_,0xff);
              auVar4 = vpermilps_avx(local_9c0._0_16_,0xff);
              auVar101 = vfmsub213ss_fma(auVar101,ZEXT416((uint)fVar92),auVar4);
              auVar181._0_8_ = auVar137._0_8_ ^ 0x8000000080000000;
              auVar181._8_4_ = auVar137._8_4_ ^ 0x80000000;
              auVar181._12_4_ = auVar137._12_4_ ^ 0x80000000;
              auVar199._0_8_ = auVar101._0_8_ ^ 0x8000000080000000;
              auVar199._8_4_ = auVar101._8_4_ ^ 0x80000000;
              auVar199._12_4_ = auVar101._12_4_ ^ 0x80000000;
              auVar159 = ZEXT416((uint)(auVar201._0_4_ * fVar92));
              auVar201 = vfmsub231ss_fma(ZEXT416((uint)(auVar137._0_4_ * auVar101._0_4_)),
                                         local_920._0_16_,auVar159);
              auVar101 = vinsertps_avx(auVar159,auVar181,0x10);
              uVar90 = auVar201._0_4_;
              auVar182._4_4_ = uVar90;
              auVar182._0_4_ = uVar90;
              auVar182._8_4_ = uVar90;
              auVar182._12_4_ = uVar90;
              auVar101 = vdivps_avx(auVar101,auVar182);
              auVar137 = ZEXT416((uint)(fVar121 - auVar238._0_4_));
              auVar238 = vinsertps_avx(local_a80._0_16_,auVar137,0x10);
              auVar160._0_4_ = auVar238._0_4_ * auVar101._0_4_;
              auVar160._4_4_ = auVar238._4_4_ * auVar101._4_4_;
              auVar160._8_4_ = auVar238._8_4_ * auVar101._8_4_;
              auVar160._12_4_ = auVar238._12_4_ * auVar101._12_4_;
              auVar101 = vinsertps_avx(auVar199,local_920._0_16_,0x1c);
              auVar101 = vdivps_avx(auVar101,auVar182);
              auVar201 = vhaddps_avx(auVar160,auVar160);
              auVar183._0_4_ = auVar238._0_4_ * auVar101._0_4_;
              auVar183._4_4_ = auVar238._4_4_ * auVar101._4_4_;
              auVar183._8_4_ = auVar238._8_4_ * auVar101._8_4_;
              auVar183._12_4_ = auVar238._12_4_ * auVar101._12_4_;
              auVar101 = vhaddps_avx(auVar183,auVar183);
              fVar152 = (float)local_ac0._0_4_ - auVar201._0_4_;
              uVar90 = 0;
              uVar224 = 0;
              uVar225 = 0;
              fVar153 = (float)local_b00._0_4_ - auVar101._0_4_;
              _local_b00 = ZEXT416((uint)fVar153);
              auVar101 = vandps_avx(local_a80._0_16_,local_600._0_16_);
              bVar57 = true;
              fVar121 = (float)local_8c0._4_4_;
              fVar150 = fStack_8b8;
              fVar281 = fStack_8b4;
              fVar155 = fStack_8b0;
              fVar151 = fStack_8ac;
              fVar282 = fStack_8a8;
              fVar92 = (float)local_8c0._0_4_;
              if ((float)local_900._0_4_ <= auVar101._0_4_) {
LAB_01924e8b:
                auVar253 = ZEXT3264(local_980);
              }
              else {
                auVar201 = vfmadd231ss_fma(ZEXT416((uint)((float)local_900._0_4_ +
                                                         (float)local_ae0._0_4_)),_local_680,
                                           ZEXT416(0x36000000));
                auVar101 = vandps_avx(auVar137,local_600._0_16_);
                if (auVar201._0_4_ <= auVar101._0_4_) goto LAB_01924e8b;
                fVar153 = fVar153 + (float)local_750._0_4_;
                bVar57 = false;
                _local_b00 = ZEXT416((uint)fVar153);
                if (fVar153 < (ray->org).field_0.m128[3]) {
                  unaff_R14B = 0;
                  goto LAB_01924e8b;
                }
                auVar253 = ZEXT3264(local_980);
                if (ray->tfar < fVar153) {
                  unaff_R14B = 0;
                  goto LAB_01924e8b;
                }
                if ((fVar152 < 0.0) || (1.0 < fVar152)) {
LAB_01924eb2:
                  bVar57 = false;
                  unaff_R14B = 0;
                }
                else {
                  local_ae0._0_4_ = ray->tfar;
                  auVar101 = vrsqrtss_avx(local_8e0._0_16_,local_8e0._0_16_);
                  fVar283 = auVar101._0_4_;
                  pGVar9 = (context->scene->geometries).items[local_a88].ptr;
                  if ((pGVar9->mask & ray->mask) == 0) goto LAB_01924eb2;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                    unaff_R14B = 1;
                  }
                  else {
                    fVar92 = fVar283 * 1.5 + local_8e0._0_4_ * -0.5 * fVar283 * fVar283 * fVar283;
                    auVar129._0_4_ = fVar92 * (float)local_7c0._0_4_;
                    auVar129._4_4_ = fVar92 * (float)local_7c0._4_4_;
                    auVar129._8_4_ = fVar92 * fStack_7b8;
                    auVar129._12_4_ = fVar92 * fStack_7b4;
                    auVar4 = vfmadd213ps_fma(auVar4,auVar129,local_9c0._0_16_);
                    auVar101 = vshufps_avx(auVar129,auVar129,0xc9);
                    auVar268 = ZEXT1664(auVar101);
                    auVar201 = vshufps_avx(local_9c0._0_16_,local_9c0._0_16_,0xc9);
                    auVar130._0_4_ = auVar129._0_4_ * auVar201._0_4_;
                    auVar130._4_4_ = auVar129._4_4_ * auVar201._4_4_;
                    auVar130._8_4_ = auVar129._8_4_ * auVar201._8_4_;
                    auVar130._12_4_ = auVar129._12_4_ * auVar201._12_4_;
                    auVar137 = vfmsub231ps_fma(auVar130,local_9c0._0_16_,auVar101);
                    auVar201 = vshufps_avx(auVar137,auVar137,0xc9);
                    auVar238 = vshufps_avx(auVar4,auVar4,0xc9);
                    auVar137 = vshufps_avx(auVar137,auVar137,0xd2);
                    auVar99._0_4_ = auVar4._0_4_ * auVar137._0_4_;
                    auVar99._4_4_ = auVar4._4_4_ * auVar137._4_4_;
                    auVar99._8_4_ = auVar4._8_4_ * auVar137._8_4_;
                    auVar99._12_4_ = auVar4._12_4_ * auVar137._12_4_;
                    auVar238 = vfmsub231ps_fma(auVar99,auVar201,auVar238);
                    auVar201 = vshufps_avx(auVar238,auVar238,0xe9);
                    local_960 = vmovlps_avx(auVar201);
                    local_958 = auVar238._0_4_;
                    local_950 = 0;
                    local_94c = (undefined4)local_928;
                    local_948 = (undefined4)local_a88;
                    local_944 = context->user->instID[0];
                    local_940 = context->user->instPrimID[0];
                    ray->tfar = fVar153;
                    local_b04 = -1;
                    local_a10.valid = &local_b04;
                    local_a10.geometryUserPtr = pGVar9->userPtr;
                    local_a10.context = context->user;
                    local_a10.hit = (RTCHitN *)&local_960;
                    local_a10.N = 1;
                    local_ac0._0_16_ = ZEXT416((uint)fVar152);
                    local_a10.ray = (RTCRayN *)ray;
                    local_954 = fVar152;
                    if (pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01925038:
                      p_Var13 = context->args->filter;
                      fVar153 = (float)local_ae0._0_4_;
                      fVar92 = (float)local_8c0._0_4_;
                      fVar121 = (float)local_8c0._4_4_;
                      fVar150 = fStack_8b8;
                      fVar281 = fStack_8b4;
                      fVar155 = fStack_8b0;
                      fVar151 = fStack_8ac;
                      fVar282 = fStack_8a8;
                      if (p_Var13 != (RTCFilterFunctionN)0x0) {
                        if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                           (((pGVar9->field_8).field_0x2 & 0x40) != 0)) {
                          auVar268 = ZEXT1664(auVar268._0_16_);
                          (*p_Var13)(&local_a10);
                          auVar253 = ZEXT3264(local_980);
                          fVar92 = (float)local_8c0._0_4_;
                          fVar121 = (float)local_8c0._4_4_;
                          fVar150 = fStack_8b8;
                          fVar281 = fStack_8b4;
                          fVar155 = fStack_8b0;
                          fVar151 = fStack_8ac;
                          fVar282 = fStack_8a8;
                          fVar152 = (float)local_ac0._0_4_;
                          uVar90 = local_ac0._4_4_;
                          uVar224 = local_ac0._8_4_;
                          uVar225 = local_ac0._12_4_;
                        }
                        fVar153 = (float)local_ae0._0_4_;
                        if (*local_a10.valid == 0) {
                          unaff_R14B = 0;
                          goto LAB_019250cb;
                        }
                      }
                      unaff_R14B = 1;
                    }
                    else {
                      auVar268 = ZEXT1664(auVar101);
                      (*pGVar9->occlusionFilterN)(&local_a10);
                      auVar253 = ZEXT3264(local_980);
                      fVar152 = (float)local_ac0._0_4_;
                      uVar90 = local_ac0._4_4_;
                      uVar224 = local_ac0._8_4_;
                      uVar225 = local_ac0._12_4_;
                      if (*local_a10.valid != 0) goto LAB_01925038;
                      unaff_R14B = 0;
                      fVar153 = (float)local_ae0._0_4_;
                      fVar92 = (float)local_8c0._0_4_;
                      fVar121 = (float)local_8c0._4_4_;
                      fVar150 = fStack_8b8;
                      fVar281 = fStack_8b4;
                      fVar155 = fStack_8b0;
                      fVar151 = fStack_8ac;
                      fVar282 = fStack_8a8;
                    }
LAB_019250cb:
                    if (unaff_R14B == 0) {
                      ray->tfar = fVar153;
                    }
                  }
                  bVar57 = false;
                }
              }
              if (!bVar57) goto LAB_019250e2;
              lVar87 = lVar87 + -1;
            } while (lVar87 != 0);
            unaff_R14B = 0;
LAB_019250e2:
            unaff_R14B = unaff_R14B & 1;
            bVar86 = bVar86 | unaff_R14B;
            fVar152 = ray->tfar;
            auVar114._4_4_ = fVar152;
            auVar114._0_4_ = fVar152;
            auVar114._8_4_ = fVar152;
            auVar114._12_4_ = fVar152;
            auVar114._16_4_ = fVar152;
            auVar114._20_4_ = fVar152;
            auVar114._24_4_ = fVar152;
            auVar114._28_4_ = fVar152;
            auVar17 = vcmpps_avx(_local_6e0,auVar114,2);
            auVar113 = vandps_avx(auVar17,local_520);
            auVar243 = ZEXT3264(auVar113);
            auVar17 = local_520 & auVar17;
            uVar91 = local_560._0_8_;
            auVar266 = local_880;
            auVar273 = local_8a0;
            local_520 = auVar113;
          } while ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(auVar17 >> 0x7f,0) != '\0') ||
                     (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(auVar17 >> 0xbf,0) != '\0') ||
                   (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   auVar17[0x1f] < '\0');
        }
        auVar119._0_4_ = fVar92 * (float)local_5c0._0_4_;
        auVar119._4_4_ = fVar121 * (float)local_5c0._4_4_;
        auVar119._8_4_ = fVar150 * fStack_5b8;
        auVar119._12_4_ = fVar281 * fStack_5b4;
        auVar119._16_4_ = fVar155 * fStack_5b0;
        auVar119._20_4_ = fVar151 * fStack_5ac;
        auVar119._28_36_ = auVar243._28_36_;
        auVar119._24_4_ = fVar282 * fStack_5a8;
        auVar101 = vfmadd213ps_fma(local_5a0,auVar273,auVar119._0_32_);
        auVar101 = vfmadd213ps_fma(local_580,auVar266,ZEXT1632(auVar101));
        auVar113 = vandps_avx(ZEXT1632(auVar101),local_720);
        auVar145._8_4_ = 0x3e99999a;
        auVar145._0_8_ = 0x3e99999a3e99999a;
        auVar145._12_4_ = 0x3e99999a;
        auVar145._16_4_ = 0x3e99999a;
        auVar145._20_4_ = 0x3e99999a;
        auVar145._24_4_ = 0x3e99999a;
        auVar145._28_4_ = 0x3e99999a;
        auVar113 = vcmpps_avx(auVar113,auVar145,1);
        auVar17 = vorps_avx(auVar113,local_300);
        auVar146._0_4_ = (float)local_800._0_4_ + (float)local_4e0._0_4_;
        auVar146._4_4_ = (float)local_800._4_4_ + (float)local_4e0._4_4_;
        auVar146._8_4_ = fStack_7f8 + fStack_4d8;
        auVar146._12_4_ = fStack_7f4 + fStack_4d4;
        auVar146._16_4_ = fStack_7f0 + fStack_4d0;
        auVar146._20_4_ = fStack_7ec + fStack_4cc;
        auVar146._24_4_ = fStack_7e8 + fStack_4c8;
        auVar146._28_4_ = fStack_7e4 + fStack_4c4;
        fVar92 = ray->tfar;
        auVar169._4_4_ = fVar92;
        auVar169._0_4_ = fVar92;
        auVar169._8_4_ = fVar92;
        auVar169._12_4_ = fVar92;
        auVar169._16_4_ = fVar92;
        auVar169._20_4_ = fVar92;
        auVar169._24_4_ = fVar92;
        auVar169._28_4_ = fVar92;
        auVar113 = vcmpps_avx(auVar146,auVar169,2);
        _local_680 = vandps_avx(auVar113,local_500);
        auVar147._8_4_ = 3;
        auVar147._0_8_ = 0x300000003;
        auVar147._12_4_ = 3;
        auVar147._16_4_ = 3;
        auVar147._20_4_ = 3;
        auVar147._24_4_ = 3;
        auVar147._28_4_ = 3;
        auVar170._8_4_ = 2;
        auVar170._0_8_ = 0x200000002;
        auVar170._12_4_ = 2;
        auVar170._16_4_ = 2;
        auVar170._20_4_ = 2;
        auVar170._24_4_ = 2;
        auVar170._28_4_ = 2;
        auVar113 = vblendvps_avx(auVar170,auVar147,auVar17);
        _local_6e0 = vpcmpgtd_avx2(auVar113,local_320);
        auVar113 = vpandn_avx2(_local_6e0,_local_680);
        auVar17 = _local_680 & ~_local_6e0;
        if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar17 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar17 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar17 >> 0x7f,0) == '\0') &&
              (auVar17 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar17 >> 0xbf,0) == '\0') &&
            (auVar17 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar17[0x1f]) {
          auVar243 = ZEXT3264(local_860);
          local_560._0_8_ = uVar91;
        }
        else {
          auVar201 = vminps_avx(local_a20,local_a40);
          auVar101 = vmaxps_avx(local_a20,local_a40);
          auVar238 = vminps_avx(local_a30,_local_a50);
          auVar137 = vminps_avx(auVar201,auVar238);
          auVar201 = vmaxps_avx(local_a30,_local_a50);
          auVar238 = vmaxps_avx(auVar101,auVar201);
          local_8a0._8_4_ = 0x7fffffff;
          local_8a0._0_8_ = 0x7fffffff7fffffff;
          local_8a0._12_4_ = 0x7fffffff;
          auVar101 = vandps_avx(auVar137,local_8a0._0_16_);
          auVar201 = vandps_avx(auVar238,local_8a0._0_16_);
          auVar101 = vmaxps_avx(auVar101,auVar201);
          auVar201 = vmovshdup_avx(auVar101);
          auVar201 = vmaxss_avx(auVar201,auVar101);
          auVar101 = vshufpd_avx(auVar101,auVar101,1);
          auVar101 = vmaxss_avx(auVar101,auVar201);
          local_7a0._0_4_ = auVar101._0_4_ * 1.9073486e-06;
          local_620._0_16_ = vshufps_avx(auVar238,auVar238,0xff);
          local_640 = _local_400;
          local_660._4_4_ = (float)local_800._4_4_ + (float)local_400._4_4_;
          local_660._0_4_ = (float)local_800._0_4_ + (float)local_400._0_4_;
          fStack_658 = fStack_7f8 + fStack_3f8;
          fStack_654 = fStack_7f4 + fStack_3f4;
          fStack_650 = fStack_7f0 + fStack_3f0;
          fStack_64c = fStack_7ec + fStack_3ec;
          fStack_648 = fStack_7e8 + fStack_3e8;
          fStack_644 = fStack_7e4 + fStack_3e4;
          do {
            auVar148._8_4_ = 0x7f800000;
            auVar148._0_8_ = 0x7f8000007f800000;
            auVar148._12_4_ = 0x7f800000;
            auVar148._16_4_ = 0x7f800000;
            auVar148._20_4_ = 0x7f800000;
            auVar148._24_4_ = 0x7f800000;
            auVar148._28_4_ = 0x7f800000;
            auVar17 = vblendvps_avx(auVar148,local_640,auVar113);
            auVar18 = vshufps_avx(auVar17,auVar17,0xb1);
            auVar18 = vminps_avx(auVar17,auVar18);
            auVar19 = vshufpd_avx(auVar18,auVar18,5);
            auVar18 = vminps_avx(auVar18,auVar19);
            auVar19 = vpermpd_avx2(auVar18,0x4e);
            auVar18 = vminps_avx(auVar18,auVar19);
            auVar18 = vcmpps_avx(auVar17,auVar18,0);
            auVar19 = auVar113 & auVar18;
            auVar17 = auVar113;
            if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar19 >> 0x7f,0) != '\0') ||
                  (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar19 >> 0xbf,0) != '\0') ||
                (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar19[0x1f] < '\0') {
              auVar17 = vandps_avx(auVar18,auVar113);
            }
            uVar84 = vmovmskps_avx(auVar17);
            iVar22 = 0;
            for (; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x80000000) {
              iVar22 = iVar22 + 1;
            }
            uVar84 = iVar22 << 2;
            local_540 = auVar113;
            *(undefined4 *)(local_540 + uVar84) = 0;
            aVar2 = (ray->dir).field_0;
            local_780._0_16_ = (undefined1  [16])aVar2;
            auVar101 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
            auVar268 = ZEXT464(*(uint *)(local_440 + uVar84));
            if (auVar101._0_4_ < 0.0) {
              _local_b00 = ZEXT416(*(uint *)(local_440 + uVar84));
              local_ac0._0_16_ = ZEXT416((uint)*(float *)(local_3e0 + uVar84));
              fVar121 = sqrtf(auVar101._0_4_);
              auVar268 = ZEXT1664(_local_b00);
              fVar92 = (float)local_ac0._0_4_;
              uVar90 = local_ac0._4_4_;
              uVar224 = local_ac0._8_4_;
              uVar225 = local_ac0._12_4_;
            }
            else {
              auVar101 = vsqrtss_avx(auVar101,auVar101);
              fVar121 = auVar101._0_4_;
              fVar92 = *(float *)(local_3e0 + uVar84);
              uVar90 = 0;
              uVar224 = 0;
              uVar225 = 0;
            }
            local_880._0_4_ = fVar121 * 1.9073486e-06;
            lVar87 = 5;
            do {
              auVar113 = local_ac0;
              fVar150 = auVar268._0_4_;
              fVar121 = 1.0 - fVar150;
              auVar131._0_4_ = local_a40._0_4_ * fVar150;
              auVar131._4_4_ = local_a40._4_4_ * fVar150;
              auVar131._8_4_ = local_a40._8_4_ * fVar150;
              auVar131._12_4_ = local_a40._12_4_ * fVar150;
              auVar161._4_4_ = fVar121;
              auVar161._0_4_ = fVar121;
              auVar161._8_4_ = fVar121;
              auVar161._12_4_ = fVar121;
              auVar101 = vfmadd231ps_fma(auVar131,auVar161,local_a20);
              auVar184._0_4_ = local_a30._0_4_ * fVar150;
              auVar184._4_4_ = local_a30._4_4_ * fVar150;
              auVar184._8_4_ = local_a30._8_4_ * fVar150;
              auVar184._12_4_ = local_a30._12_4_ * fVar150;
              auVar201 = vfmadd231ps_fma(auVar184,auVar161,local_a40);
              auVar217._0_4_ = fVar150 * auVar201._0_4_;
              auVar217._4_4_ = fVar150 * auVar201._4_4_;
              auVar217._8_4_ = fVar150 * auVar201._8_4_;
              auVar217._12_4_ = fVar150 * auVar201._12_4_;
              local_9c0._0_16_ = vfmadd231ps_fma(auVar217,auVar161,auVar101);
              auVar132._0_4_ = fVar150 * (float)local_a50._0_4_;
              auVar132._4_4_ = fVar150 * (float)local_a50._4_4_;
              auVar132._8_4_ = fVar150 * fStack_a48;
              auVar132._12_4_ = fVar150 * fStack_a44;
              auVar101 = vfmadd231ps_fma(auVar132,auVar161,local_a30);
              auVar200._0_4_ = fVar150 * auVar101._0_4_;
              auVar200._4_4_ = fVar150 * auVar101._4_4_;
              auVar200._8_4_ = fVar150 * auVar101._8_4_;
              auVar200._12_4_ = fVar150 * auVar101._12_4_;
              auVar201 = vfmadd231ps_fma(auVar200,auVar161,auVar201);
              auVar133._4_4_ = fVar92;
              auVar133._0_4_ = fVar92;
              auVar133._8_4_ = fVar92;
              auVar133._12_4_ = fVar92;
              auVar101 = vfmadd213ps_fma(auVar133,local_780._0_16_,_DAT_01feba10);
              auVar100._0_4_ = fVar150 * auVar201._0_4_;
              auVar100._4_4_ = fVar150 * auVar201._4_4_;
              auVar100._8_4_ = fVar150 * auVar201._8_4_;
              auVar100._12_4_ = fVar150 * auVar201._12_4_;
              auVar238 = vfmadd231ps_fma(auVar100,local_9c0._0_16_,auVar161);
              local_5e0._0_16_ = auVar238;
              auVar101 = vsubps_avx(auVar101,auVar238);
              _local_7c0 = auVar101;
              auVar101 = vdpps_avx(auVar101,auVar101,0x7f);
              _local_b00 = auVar268._0_16_;
              local_ac0._4_4_ = uVar90;
              local_ac0._0_4_ = fVar92;
              local_ac0._8_4_ = uVar224;
              local_ac0._16_16_ = auVar113._16_16_;
              local_ac0._12_4_ = uVar225;
              local_8e0._0_16_ = auVar101;
              if (auVar101._0_4_ < 0.0) {
                local_ae0._0_16_ = ZEXT416((uint)fVar121);
                local_a80._0_16_ = auVar201;
                auVar120._0_4_ = sqrtf(auVar101._0_4_);
                auVar120._4_60_ = extraout_var_00;
                auVar101 = auVar120._0_16_;
                auVar201 = local_a80._0_16_;
                auVar238 = local_ae0._0_16_;
                auVar137 = _local_b00;
                fVar92 = (float)local_ac0._0_4_;
              }
              else {
                auVar101 = vsqrtss_avx(auVar101,auVar101);
                auVar238 = ZEXT416((uint)fVar121);
                auVar137 = auVar268._0_16_;
              }
              auVar201 = vsubps_avx(auVar201,local_9c0._0_16_);
              local_9c0._0_4_ = auVar201._0_4_ * 3.0;
              local_9c0._4_4_ = auVar201._4_4_ * 3.0;
              local_9c0._8_4_ = auVar201._8_4_ * 3.0;
              local_9c0._12_4_ = auVar201._12_4_ * 3.0;
              auVar201 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar238,auVar137);
              auVar4 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar137,auVar238);
              fVar121 = auVar238._0_4_ * 6.0;
              fVar150 = auVar201._0_4_ * 6.0;
              fVar281 = auVar4._0_4_ * 6.0;
              fVar155 = auVar137._0_4_ * 6.0;
              auVar185._0_4_ = fVar155 * (float)local_a50._0_4_;
              auVar185._4_4_ = fVar155 * (float)local_a50._4_4_;
              auVar185._8_4_ = fVar155 * fStack_a48;
              auVar185._12_4_ = fVar155 * fStack_a44;
              auVar134._4_4_ = fVar281;
              auVar134._0_4_ = fVar281;
              auVar134._8_4_ = fVar281;
              auVar134._12_4_ = fVar281;
              auVar201 = vfmadd132ps_fma(auVar134,auVar185,local_a30);
              auVar186._4_4_ = fVar150;
              auVar186._0_4_ = fVar150;
              auVar186._8_4_ = fVar150;
              auVar186._12_4_ = fVar150;
              auVar201 = vfmadd132ps_fma(auVar186,auVar201,local_a40);
              auVar238 = vdpps_avx(local_9c0._0_16_,local_9c0._0_16_,0x7f);
              auVar135._4_4_ = fVar121;
              auVar135._0_4_ = fVar121;
              auVar135._8_4_ = fVar121;
              auVar135._12_4_ = fVar121;
              auVar4 = vfmadd132ps_fma(auVar135,auVar201,local_a20);
              auVar201 = vblendps_avx(auVar238,_DAT_01feba10,0xe);
              auVar137 = vrsqrtss_avx(auVar201,auVar201);
              fVar281 = auVar238._0_4_;
              fVar121 = auVar137._0_4_;
              auVar137 = vdpps_avx(local_9c0._0_16_,auVar4,0x7f);
              fVar121 = fVar121 * 1.5 + fVar281 * -0.5 * fVar121 * fVar121 * fVar121;
              auVar136._0_4_ = auVar4._0_4_ * fVar281;
              auVar136._4_4_ = auVar4._4_4_ * fVar281;
              auVar136._8_4_ = auVar4._8_4_ * fVar281;
              auVar136._12_4_ = auVar4._12_4_ * fVar281;
              fVar150 = auVar137._0_4_;
              auVar218._0_4_ = local_9c0._0_4_ * fVar150;
              auVar218._4_4_ = local_9c0._4_4_ * fVar150;
              auVar218._8_4_ = local_9c0._8_4_ * fVar150;
              auVar218._12_4_ = local_9c0._12_4_ * fVar150;
              auVar137 = vsubps_avx(auVar136,auVar218);
              auVar201 = vrcpss_avx(auVar201,auVar201);
              auVar4 = vfnmadd213ss_fma(auVar201,auVar238,ZEXT416(0x40000000));
              fVar150 = auVar201._0_4_ * auVar4._0_4_;
              auVar201 = vmaxss_avx(ZEXT416((uint)local_7a0._0_4_),
                                    ZEXT416((uint)(fVar92 * (float)local_880._0_4_)));
              local_ae0._0_4_ = auVar201._0_4_;
              uVar91 = CONCAT44(local_9c0._4_4_,local_9c0._0_4_);
              auVar240._0_8_ = uVar91 ^ 0x8000000080000000;
              auVar240._8_4_ = -local_9c0._8_4_;
              auVar240._12_4_ = -local_9c0._12_4_;
              local_7e0._0_4_ = fVar121 * auVar137._0_4_ * fVar150;
              local_7e0._4_4_ = fVar121 * auVar137._4_4_ * fVar150;
              local_7e0._8_4_ = fVar121 * auVar137._8_4_ * fVar150;
              local_7e0._12_4_ = fVar121 * auVar137._12_4_ * fVar150;
              local_920._0_4_ = local_9c0._0_4_ * fVar121;
              local_920._4_4_ = local_9c0._4_4_ * fVar121;
              local_920._8_4_ = local_9c0._8_4_ * fVar121;
              local_920._12_4_ = local_9c0._12_4_ * fVar121;
              if (fVar281 < -fVar281) {
                local_a80._0_4_ = auVar101._0_4_;
                local_900._0_16_ = auVar240;
                fVar92 = sqrtf(fVar281);
                auVar101 = ZEXT416((uint)local_a80._0_4_);
                auVar240 = local_900._0_16_;
              }
              else {
                auVar201 = vsqrtss_avx(auVar238,auVar238);
                fVar92 = auVar201._0_4_;
              }
              local_a80._0_16_ = vdpps_avx(_local_7c0,local_920._0_16_,0x7f);
              auVar4 = vfmadd213ss_fma(ZEXT416((uint)local_7a0._0_4_),auVar101,
                                       ZEXT416((uint)local_ae0._0_4_));
              auVar201 = vdpps_avx(auVar240,local_920._0_16_,0x7f);
              auVar238 = vdpps_avx(_local_7c0,local_7e0._0_16_,0x7f);
              auVar137 = vdpps_avx(local_780._0_16_,local_920._0_16_,0x7f);
              auVar101 = vfmadd213ss_fma(ZEXT416((uint)(auVar101._0_4_ + 1.0)),
                                         ZEXT416((uint)((float)local_7a0._0_4_ / fVar92)),auVar4);
              local_900._0_4_ = auVar101._0_4_;
              auVar102._0_4_ = local_a80._0_4_ * local_a80._0_4_;
              auVar102._4_4_ = local_a80._4_4_ * local_a80._4_4_;
              auVar102._8_4_ = local_a80._8_4_ * local_a80._8_4_;
              auVar102._12_4_ = local_a80._12_4_ * local_a80._12_4_;
              auVar101 = vdpps_avx(_local_7c0,auVar240,0x7f);
              auVar159 = vsubps_avx(local_8e0._0_16_,auVar102);
              auVar4 = vrsqrtss_avx(auVar159,auVar159);
              fVar121 = auVar159._0_4_;
              fVar92 = auVar4._0_4_;
              fVar92 = fVar92 * 1.5 + fVar121 * -0.5 * fVar92 * fVar92 * fVar92;
              auVar4 = vdpps_avx(_local_7c0,local_780._0_16_,0x7f);
              local_920._0_16_ = ZEXT416((uint)(auVar201._0_4_ + auVar238._0_4_));
              local_7e0._0_16_ = vfnmadd231ss_fma(auVar101,local_a80._0_16_,local_920._0_16_);
              auVar101 = vfnmadd231ss_fma(auVar4,local_a80._0_16_,auVar137);
              if (fVar121 < 0.0) {
                _local_8c0 = auVar137;
                local_600._0_4_ = fVar92;
                local_820._0_16_ = auVar101;
                fVar121 = sqrtf(fVar121);
                fVar92 = (float)local_600._0_4_;
                auVar101 = local_820._0_16_;
                auVar137 = _local_8c0;
              }
              else {
                auVar201 = vsqrtss_avx(auVar159,auVar159);
                fVar121 = auVar201._0_4_;
              }
              auVar253 = ZEXT3264(local_980);
              auVar243 = ZEXT3264(local_860);
              auVar201 = vpermilps_avx(local_5e0._0_16_,0xff);
              auVar4 = vpermilps_avx(local_9c0._0_16_,0xff);
              auVar238 = vfmsub213ss_fma(local_7e0._0_16_,ZEXT416((uint)fVar92),auVar4);
              auVar187._0_8_ = auVar137._0_8_ ^ 0x8000000080000000;
              auVar187._8_4_ = auVar137._8_4_ ^ 0x80000000;
              auVar187._12_4_ = auVar137._12_4_ ^ 0x80000000;
              auVar202._0_8_ = auVar238._0_8_ ^ 0x8000000080000000;
              auVar202._8_4_ = auVar238._8_4_ ^ 0x80000000;
              auVar202._12_4_ = auVar238._12_4_ ^ 0x80000000;
              auVar101 = ZEXT416((uint)(auVar101._0_4_ * fVar92));
              auVar238 = vfmsub231ss_fma(ZEXT416((uint)(auVar137._0_4_ * auVar238._0_4_)),
                                         local_920._0_16_,auVar101);
              auVar101 = vinsertps_avx(auVar101,auVar187,0x10);
              uVar90 = auVar238._0_4_;
              auVar188._4_4_ = uVar90;
              auVar188._0_4_ = uVar90;
              auVar188._8_4_ = uVar90;
              auVar188._12_4_ = uVar90;
              auVar101 = vdivps_avx(auVar101,auVar188);
              auVar137 = ZEXT416((uint)(fVar121 - auVar201._0_4_));
              auVar238 = vinsertps_avx(local_a80._0_16_,auVar137,0x10);
              auVar162._0_4_ = auVar238._0_4_ * auVar101._0_4_;
              auVar162._4_4_ = auVar238._4_4_ * auVar101._4_4_;
              auVar162._8_4_ = auVar238._8_4_ * auVar101._8_4_;
              auVar162._12_4_ = auVar238._12_4_ * auVar101._12_4_;
              auVar101 = vinsertps_avx(auVar202,local_920._0_16_,0x1c);
              auVar101 = vdivps_avx(auVar101,auVar188);
              auVar201 = vhaddps_avx(auVar162,auVar162);
              auVar189._0_4_ = auVar238._0_4_ * auVar101._0_4_;
              auVar189._4_4_ = auVar238._4_4_ * auVar101._4_4_;
              auVar189._8_4_ = auVar238._8_4_ * auVar101._8_4_;
              auVar189._12_4_ = auVar238._12_4_ * auVar101._12_4_;
              auVar101 = vhaddps_avx(auVar189,auVar189);
              fVar121 = (float)local_b00._0_4_ - auVar201._0_4_;
              auVar268 = ZEXT464((uint)fVar121);
              fVar92 = (float)local_ac0._0_4_ - auVar101._0_4_;
              uVar90 = 0;
              uVar224 = 0;
              uVar225 = 0;
              auVar101 = vandps_avx(local_a80._0_16_,local_8a0._0_16_);
              bVar57 = true;
              if (auVar101._0_4_ < (float)local_900._0_4_) {
                auVar201 = vfmadd231ss_fma(ZEXT416((uint)((float)local_900._0_4_ +
                                                         (float)local_ae0._0_4_)),local_620._0_16_,
                                           ZEXT416(0x36000000));
                auVar101 = vandps_avx(auVar137,local_8a0._0_16_);
                if (auVar101._0_4_ < auVar201._0_4_) {
                  fVar92 = fVar92 + (float)local_750._0_4_;
                  uVar90 = 0;
                  uVar224 = 0;
                  uVar225 = 0;
                  if (((((ray->org).field_0.m128[3] <= fVar92) && (fVar92 <= ray->tfar)) &&
                      (0.0 <= fVar121)) && (fVar121 <= 1.0)) {
                    auVar101 = vrsqrtss_avx(local_8e0._0_16_,local_8e0._0_16_);
                    fVar150 = auVar101._0_4_;
                    pGVar9 = (context->scene->geometries).items[local_a88].ptr;
                    if ((pGVar9->mask & ray->mask) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        unaff_R14B = 1;
                      }
                      else {
                        local_ae0._0_4_ = ray->tfar;
                        fVar150 = fVar150 * 1.5 +
                                  local_8e0._0_4_ * -0.5 * fVar150 * fVar150 * fVar150;
                        auVar138._0_4_ = fVar150 * (float)local_7c0._0_4_;
                        auVar138._4_4_ = fVar150 * (float)local_7c0._4_4_;
                        auVar138._8_4_ = fVar150 * fStack_7b8;
                        auVar138._12_4_ = fVar150 * fStack_7b4;
                        auVar137 = vfmadd213ps_fma(auVar4,auVar138,local_9c0._0_16_);
                        auVar101 = vshufps_avx(auVar138,auVar138,0xc9);
                        auVar201 = vshufps_avx(local_9c0._0_16_,local_9c0._0_16_,0xc9);
                        auVar139._0_4_ = auVar138._0_4_ * auVar201._0_4_;
                        auVar139._4_4_ = auVar138._4_4_ * auVar201._4_4_;
                        auVar139._8_4_ = auVar138._8_4_ * auVar201._8_4_;
                        auVar139._12_4_ = auVar138._12_4_ * auVar201._12_4_;
                        auVar238 = vfmsub231ps_fma(auVar139,local_9c0._0_16_,auVar101);
                        auVar101 = vshufps_avx(auVar238,auVar238,0xc9);
                        auVar201 = vshufps_avx(auVar137,auVar137,0xc9);
                        auVar238 = vshufps_avx(auVar238,auVar238,0xd2);
                        auVar103._0_4_ = auVar137._0_4_ * auVar238._0_4_;
                        auVar103._4_4_ = auVar137._4_4_ * auVar238._4_4_;
                        auVar103._8_4_ = auVar137._8_4_ * auVar238._8_4_;
                        auVar103._12_4_ = auVar137._12_4_ * auVar238._12_4_;
                        auVar201 = vfmsub231ps_fma(auVar103,auVar101,auVar201);
                        auVar101 = vshufps_avx(auVar201,auVar201,0xe9);
                        local_960 = vmovlps_avx(auVar101);
                        local_958 = auVar201._0_4_;
                        local_950 = 0;
                        local_94c = (undefined4)local_928;
                        local_948 = (undefined4)local_a88;
                        local_944 = context->user->instID[0];
                        local_940 = context->user->instPrimID[0];
                        ray->tfar = fVar92;
                        local_b04 = -1;
                        local_a10.valid = &local_b04;
                        local_a10.geometryUserPtr = pGVar9->userPtr;
                        local_a10.context = context->user;
                        local_a10.hit = (RTCHitN *)&local_960;
                        local_a10.N = 1;
                        _local_b00 = ZEXT416((uint)fVar121);
                        local_ac0._0_16_ = ZEXT416((uint)fVar92);
                        local_a10.ray = (RTCRayN *)ray;
                        local_954 = fVar121;
                        if (pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01925a27:
                          p_Var13 = context->args->filter;
                          fVar121 = (float)local_ae0._0_4_;
                          if (p_Var13 != (RTCFilterFunctionN)0x0) {
                            if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar9->field_8).field_0x2 & 0x40) != 0)) {
                              (*p_Var13)(&local_a10);
                              auVar268 = ZEXT1664(_local_b00);
                              auVar243 = ZEXT3264(local_860);
                              auVar253 = ZEXT3264(local_980);
                              fVar92 = (float)local_ac0._0_4_;
                              uVar90 = local_ac0._4_4_;
                              uVar224 = local_ac0._8_4_;
                              uVar225 = local_ac0._12_4_;
                            }
                            fVar121 = (float)local_ae0._0_4_;
                            if (*local_a10.valid == 0) {
                              unaff_R14B = 0;
                              goto LAB_01925aae;
                            }
                          }
                          unaff_R14B = 1;
                        }
                        else {
                          (*pGVar9->occlusionFilterN)(&local_a10);
                          auVar268 = ZEXT1664(_local_b00);
                          auVar243 = ZEXT3264(local_860);
                          auVar253 = ZEXT3264(local_980);
                          fVar92 = (float)local_ac0._0_4_;
                          uVar90 = local_ac0._4_4_;
                          uVar224 = local_ac0._8_4_;
                          uVar225 = local_ac0._12_4_;
                          if (*local_a10.valid != 0) goto LAB_01925a27;
                          unaff_R14B = 0;
                          fVar121 = (float)local_ae0._0_4_;
                        }
LAB_01925aae:
                        if (unaff_R14B == 0) {
                          ray->tfar = fVar121;
                        }
                      }
                      bVar57 = false;
                      goto LAB_0192589a;
                    }
                  }
                  bVar57 = false;
                  unaff_R14B = 0;
                }
              }
LAB_0192589a:
              if (!bVar57) goto LAB_01925ac5;
              lVar87 = lVar87 + -1;
            } while (lVar87 != 0);
            unaff_R14B = 0;
LAB_01925ac5:
            unaff_R14B = unaff_R14B & 1;
            bVar86 = bVar86 | unaff_R14B;
            fVar92 = ray->tfar;
            auVar115._4_4_ = fVar92;
            auVar115._0_4_ = fVar92;
            auVar115._8_4_ = fVar92;
            auVar115._12_4_ = fVar92;
            auVar115._16_4_ = fVar92;
            auVar115._20_4_ = fVar92;
            auVar115._24_4_ = fVar92;
            auVar115._28_4_ = fVar92;
            auVar17 = vcmpps_avx(_local_660,auVar115,2);
            auVar113 = vandps_avx(auVar17,local_540);
            local_540 = local_540 & auVar17;
          } while ((((((((local_540 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (local_540 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (local_540 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(local_540 >> 0x7f,0) != '\0') ||
                     (local_540 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(local_540 >> 0xbf,0) != '\0') ||
                   (local_540 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   local_540[0x1f] < '\0');
        }
        auVar149._0_4_ = (float)local_800._0_4_ + local_3c0._0_4_;
        auVar149._4_4_ = (float)local_800._4_4_ + local_3c0._4_4_;
        auVar149._8_4_ = fStack_7f8 + local_3c0._8_4_;
        auVar149._12_4_ = fStack_7f4 + local_3c0._12_4_;
        auVar149._16_4_ = fStack_7f0 + local_3c0._16_4_;
        auVar149._20_4_ = fStack_7ec + local_3c0._20_4_;
        auVar149._24_4_ = fStack_7e8 + local_3c0._24_4_;
        auVar149._28_4_ = fStack_7e4 + local_3c0._28_4_;
        fVar92 = ray->tfar;
        auVar195._4_4_ = fVar92;
        auVar195._0_4_ = fVar92;
        auVar195._8_4_ = fVar92;
        auVar195._12_4_ = fVar92;
        auVar195._16_4_ = fVar92;
        auVar195._20_4_ = fVar92;
        auVar195._24_4_ = fVar92;
        auVar195._28_4_ = fVar92;
        auVar17 = vcmpps_avx(auVar149,auVar195,2);
        auVar113 = vandps_avx(local_4c0,local_4a0);
        auVar113 = vandps_avx(auVar17,auVar113);
        auVar206._0_4_ = (float)local_800._0_4_ + local_400._0_4_;
        auVar206._4_4_ = (float)local_800._4_4_ + local_400._4_4_;
        auVar206._8_4_ = fStack_7f8 + local_400._8_4_;
        auVar206._12_4_ = fStack_7f4 + local_400._12_4_;
        auVar206._16_4_ = fStack_7f0 + local_400._16_4_;
        auVar206._20_4_ = fStack_7ec + local_400._20_4_;
        auVar206._24_4_ = fStack_7e8 + local_400._24_4_;
        auVar206._28_4_ = fStack_7e4 + local_400._28_4_;
        auVar18 = vcmpps_avx(auVar206,auVar195,2);
        auVar17 = vandps_avx(_local_6e0,_local_680);
        auVar17 = vandps_avx(auVar18,auVar17);
        auVar17 = vorps_avx(auVar113,auVar17);
        uVar91 = local_560._0_8_;
        if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar17 >> 0x7f,0) != '\0') ||
              (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar17 >> 0xbf,0) != '\0') ||
            (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar17[0x1f] < '\0') {
          *(undefined1 (*) [32])(auStack_180 + uVar85 * 0x60) = auVar17;
          auVar113 = vblendvps_avx(_local_400,local_3c0,auVar113);
          *(undefined1 (*) [32])(auStack_160 + uVar85 * 0x60) = auVar113;
          uVar93 = vmovlps_avx(local_740);
          *(undefined8 *)(afStack_140 + uVar85 * 0x18) = uVar93;
          auStack_138[uVar85 * 0x18] = (int)local_560._0_8_ + 1;
          uVar85 = (ulong)((int)uVar85 + 1);
        }
      }
    }
    auVar245 = ZEXT3264(local_840);
    fVar92 = ray->tfar;
    auVar112._4_4_ = fVar92;
    auVar112._0_4_ = fVar92;
    auVar112._8_4_ = fVar92;
    auVar112._12_4_ = fVar92;
    auVar112._16_4_ = fVar92;
    auVar112._20_4_ = fVar92;
    auVar112._24_4_ = fVar92;
    auVar112._28_4_ = fVar92;
    fVar92 = (float)local_800._0_4_;
    fVar121 = (float)local_800._4_4_;
    fVar150 = fStack_7f8;
    fVar281 = fStack_7f4;
    fVar155 = fStack_7f0;
    fVar151 = fStack_7ec;
    fVar282 = fStack_7e8;
    fVar152 = fStack_7e4;
    do {
      uVar84 = (uint)uVar85;
      if (uVar84 == 0) {
        if (bVar86 != 0) {
          return local_b11;
        }
        fVar92 = ray->tfar;
        auVar117._4_4_ = fVar92;
        auVar117._0_4_ = fVar92;
        auVar117._8_4_ = fVar92;
        auVar117._12_4_ = fVar92;
        auVar117._16_4_ = fVar92;
        auVar117._20_4_ = fVar92;
        auVar117._24_4_ = fVar92;
        auVar117._28_4_ = fVar92;
        auVar113 = vcmpps_avx(local_2e0,auVar117,2);
        uVar84 = vmovmskps_avx(auVar113);
        uVar84 = uVar84 & (uint)local_728 - 1 & (uint)local_728;
        local_b11 = uVar84 != 0;
        if (!local_b11) {
          return local_b11;
        }
        goto LAB_01923697;
      }
      uVar85 = (ulong)(uVar84 - 1);
      lVar87 = uVar85 * 0x60;
      auVar113 = *(undefined1 (*) [32])(auStack_160 + lVar87);
      auVar140._0_4_ = fVar92 + auVar113._0_4_;
      auVar140._4_4_ = fVar121 + auVar113._4_4_;
      auVar140._8_4_ = fVar150 + auVar113._8_4_;
      auVar140._12_4_ = fVar281 + auVar113._12_4_;
      auVar140._16_4_ = fVar155 + auVar113._16_4_;
      auVar140._20_4_ = fVar151 + auVar113._20_4_;
      auVar140._24_4_ = fVar282 + auVar113._24_4_;
      auVar140._28_4_ = fVar152 + auVar113._28_4_;
      auVar18 = vcmpps_avx(auVar140,auVar112,2);
      auVar17 = vandps_avx(auVar18,*(undefined1 (*) [32])(auStack_180 + lVar87));
      local_3c0 = auVar17;
      auVar18 = *(undefined1 (*) [32])(auStack_180 + lVar87) & auVar18;
      bVar79 = (auVar18 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar80 = (auVar18 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar78 = (auVar18 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar77 = SUB321(auVar18 >> 0x7f,0) == '\0';
      bVar76 = (auVar18 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar75 = SUB321(auVar18 >> 0xbf,0) == '\0';
      bVar72 = (auVar18 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar57 = -1 < auVar18[0x1f];
      if (((((((!bVar79 || !bVar80) || !bVar78) || !bVar77) || !bVar76) || !bVar75) || !bVar72) ||
          !bVar57) {
        auVar192._8_4_ = 0x7f800000;
        auVar192._0_8_ = 0x7f8000007f800000;
        auVar192._12_4_ = 0x7f800000;
        auVar192._16_4_ = 0x7f800000;
        auVar192._20_4_ = 0x7f800000;
        auVar192._24_4_ = 0x7f800000;
        auVar192._28_4_ = 0x7f800000;
        auVar113 = vblendvps_avx(auVar192,auVar113,auVar17);
        auVar18 = vshufps_avx(auVar113,auVar113,0xb1);
        auVar18 = vminps_avx(auVar113,auVar18);
        auVar19 = vshufpd_avx(auVar18,auVar18,5);
        auVar18 = vminps_avx(auVar18,auVar19);
        auVar19 = vpermpd_avx2(auVar18,0x4e);
        auVar18 = vminps_avx(auVar18,auVar19);
        auVar113 = vcmpps_avx(auVar113,auVar18,0);
        auVar18 = auVar17 & auVar113;
        if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar18 >> 0x7f,0) != '\0') ||
              (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar18 >> 0xbf,0) != '\0') ||
            (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar18[0x1f] < '\0') {
          auVar17 = vandps_avx(auVar113,auVar17);
        }
        fVar92 = afStack_140[uVar85 * 0x18 + 1];
        uVar91 = (ulong)auStack_138[uVar85 * 0x18];
        uVar88 = vmovmskps_avx(auVar17);
        iVar22 = 0;
        for (; (uVar88 & 1) == 0; uVar88 = uVar88 >> 1 | 0x80000000) {
          iVar22 = iVar22 + 1;
        }
        fVar121 = afStack_140[uVar85 * 0x18];
        auVar141._4_4_ = fVar121;
        auVar141._0_4_ = fVar121;
        auVar141._8_4_ = fVar121;
        auVar141._12_4_ = fVar121;
        auVar141._16_4_ = fVar121;
        auVar141._20_4_ = fVar121;
        auVar141._24_4_ = fVar121;
        auVar141._28_4_ = fVar121;
        *(undefined4 *)(local_3c0 + (uint)(iVar22 << 2)) = 0;
        *(undefined1 (*) [32])(auStack_180 + lVar87) = local_3c0;
        uVar88 = uVar84 - 1;
        if ((((((((local_3c0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (local_3c0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (local_3c0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(local_3c0 >> 0x7f,0) != '\0') ||
              (local_3c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(local_3c0 >> 0xbf,0) != '\0') ||
            (local_3c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_3c0[0x1f] < '\0') {
          uVar88 = uVar84;
        }
        fVar92 = fVar92 - fVar121;
        auVar165._4_4_ = fVar92;
        auVar165._0_4_ = fVar92;
        auVar165._8_4_ = fVar92;
        auVar165._12_4_ = fVar92;
        auVar165._16_4_ = fVar92;
        auVar165._20_4_ = fVar92;
        auVar165._24_4_ = fVar92;
        auVar165._28_4_ = fVar92;
        auVar101 = vfmadd132ps_fma(auVar165,auVar141,_DAT_02020f20);
        _local_400 = ZEXT1632(auVar101);
        local_740._8_8_ = 0;
        local_740._0_8_ = *(ulong *)(local_400 + (uint)(iVar22 << 2));
        uVar85 = (ulong)uVar88;
      }
      fVar92 = (float)local_800._0_4_;
      fVar121 = (float)local_800._4_4_;
      fVar150 = fStack_7f8;
      fVar281 = fStack_7f4;
      fVar155 = fStack_7f0;
      fVar151 = fStack_7ec;
      fVar282 = fStack_7e8;
      fVar152 = fStack_7e4;
    } while (((((((bVar79 && bVar80) && bVar78) && bVar77) && bVar76) && bVar75) && bVar72) &&
             bVar57);
    auVar226 = auVar253._0_32_;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }